

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int64_t iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  longlong lVar25;
  __m256i alVar26;
  __m256i alVar27;
  __m256i alVar28;
  __m256i alVar29;
  __m256i alVar30;
  __m256i c;
  __m256i c_00;
  undefined1 auVar31 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  undefined1 auVar32 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [24];
  undefined1 auVar63 [24];
  undefined1 auVar64 [24];
  undefined1 auVar65 [24];
  undefined1 auVar66 [24];
  undefined1 auVar67 [24];
  undefined1 auVar68 [24];
  long lVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int in_stack_00000008;
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m256i cond_max;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vPosMask;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m256i vOne;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined4 in_stack_ffffffffffffd730;
  undefined4 in_stack_ffffffffffffd734;
  undefined8 in_stack_ffffffffffffd738;
  undefined4 in_stack_ffffffffffffd740;
  undefined4 in_stack_ffffffffffffd744;
  undefined8 in_stack_ffffffffffffd748;
  undefined4 in_stack_ffffffffffffd750;
  undefined4 in_stack_ffffffffffffd754;
  int iVar117;
  longlong local_28a0;
  longlong lStack_2898;
  __m256i *in_stack_ffffffffffffd770;
  longlong lVar118;
  undefined8 in_stack_ffffffffffffd778;
  undefined8 in_stack_ffffffffffffd780;
  longlong lVar119;
  undefined8 in_stack_ffffffffffffd788;
  longlong lVar120;
  longlong in_stack_ffffffffffffd790;
  longlong lVar121;
  undefined8 in_stack_ffffffffffffd798;
  undefined8 in_stack_ffffffffffffd7a0;
  longlong lVar122;
  undefined8 in_stack_ffffffffffffd7a8;
  longlong lVar123;
  longlong in_stack_ffffffffffffd7b0;
  longlong lVar124;
  longlong lStack_2848;
  undefined1 local_2840 [32];
  longlong *local_2800;
  longlong *local_27f8;
  longlong *local_27f0;
  longlong *local_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  long local_2760;
  long lStack_2758;
  long lStack_2750;
  long lStack_2748;
  long local_2720;
  long lStack_2718;
  long lStack_2710;
  long lStack_2708;
  undefined1 local_26e0 [16];
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  ulong local_2520;
  ulong uStack_2518;
  ulong uStack_2510;
  ulong uStack_2508;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  ulong local_24a0;
  ulong uStack_2498;
  ulong uStack_2490;
  ulong uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  longlong local_23c0;
  longlong lStack_23b8;
  longlong lStack_23b0;
  longlong lStack_23a8;
  longlong local_23a0;
  longlong lStack_2398;
  longlong lStack_2390;
  longlong lStack_2388;
  longlong local_2380;
  longlong lStack_2378;
  longlong lStack_2370;
  longlong lStack_2368;
  longlong local_2360;
  longlong lStack_2358;
  longlong lStack_2350;
  longlong lStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  ulong local_22e0 [7];
  int local_22a8;
  int local_22a4;
  undefined1 local_22a0 [32];
  undefined1 local_2280 [32];
  parasail_result_t *local_2248;
  undefined1 local_2240 [32];
  undefined1 local_2220 [32];
  ulong local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  long local_21e0;
  long lStack_21d8;
  long lStack_21d0;
  long lStack_21c8;
  undefined1 local_21c0 [32];
  undefined1 local_21a0 [32];
  undefined1 local_2180 [32];
  undefined1 local_2160 [32];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  longlong local_20c0;
  longlong local_20b8;
  longlong local_20b0;
  ulong local_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  ulong local_2050;
  ulong local_2048;
  undefined1 local_2040 [16];
  undefined1 auStack_2030 [16];
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  int64_t *local_1fe8;
  __m256i *local_1fe0;
  __m256i *local_1fd8;
  __m256i *local_1fd0;
  __m256i *local_1fc8;
  __m256i *local_1fc0;
  __m256i *local_1fb8;
  longlong *local_1fb0;
  longlong *local_1fa8;
  longlong *local_1fa0;
  longlong *local_1f98;
  __m256i *local_1f90;
  __m256i *local_1f88;
  __m256i *local_1f80;
  __m256i *local_1f78;
  long local_1f70;
  long local_1f68;
  long local_1f60;
  int local_1f58;
  int local_1f54;
  int local_1f50;
  int local_1f4c;
  long local_1f48;
  int local_1f40;
  int local_1f3c;
  int local_1f38;
  int local_1f34;
  int local_1f30;
  int local_1f2c;
  int local_1f28;
  int local_1f24;
  int local_1f20;
  int local_1f1c;
  long local_1f18;
  parasail_result_t *local_1f08;
  ulong local_1f00;
  ulong local_1ef8;
  ulong local_1ef0;
  ulong local_1ee8;
  ulong local_1ee0;
  ulong local_1ed8;
  ulong local_1ed0;
  ulong local_1ec8;
  ulong local_1ec0;
  undefined8 local_1eb8;
  ulong local_1eb0;
  ulong local_1ea8;
  undefined1 local_1ea0 [32];
  ulong local_1e80;
  ulong uStack_1e78;
  ulong uStack_1e70;
  ulong uStack_1e68;
  ulong local_1e60;
  ulong uStack_1e58;
  ulong uStack_1e50;
  ulong uStack_1e48;
  ulong local_1e40;
  ulong uStack_1e38;
  ulong uStack_1e30;
  ulong uStack_1e28;
  ulong local_1e20;
  ulong uStack_1e18;
  ulong uStack_1e10;
  ulong uStack_1e08;
  long local_1e00;
  long lStack_1df8;
  long lStack_1df0;
  long lStack_1de8;
  long local_1de0;
  long lStack_1dd8;
  long lStack_1dd0;
  long lStack_1dc8;
  long local_1dc0;
  long lStack_1db8;
  long lStack_1db0;
  long lStack_1da8;
  long local_1da0;
  long lStack_1d98;
  long lStack_1d90;
  long lStack_1d88;
  long local_1d80;
  long lStack_1d78;
  long lStack_1d70;
  long lStack_1d68;
  long local_1d60;
  long lStack_1d58;
  long lStack_1d50;
  long lStack_1d48;
  long local_1d40;
  long lStack_1d38;
  long lStack_1d30;
  long lStack_1d28;
  long local_1d20;
  long lStack_1d18;
  long lStack_1d10;
  long lStack_1d08;
  undefined1 local_1d00 [16];
  undefined1 auStack_1cf0 [16];
  ulong local_1ce0;
  ulong local_1cd8;
  ulong local_1cd0;
  ulong local_1cc8;
  undefined1 local_1cc0 [32];
  ulong local_1ca0;
  ulong local_1c98;
  ulong local_1c90;
  ulong local_1c88;
  undefined1 local_1c80 [16];
  undefined1 auStack_1c70 [16];
  undefined8 local_1c60;
  undefined8 local_1c58;
  undefined8 local_1c50;
  undefined8 local_1c48;
  undefined1 local_1c40 [16];
  undefined1 auStack_1c30 [16];
  ulong local_1c20;
  ulong local_1c18;
  ulong local_1c10;
  ulong local_1c08;
  undefined1 local_1c00 [16];
  undefined1 auStack_1bf0 [16];
  ulong local_1be0;
  ulong local_1bd8;
  ulong local_1bd0;
  ulong local_1bc8;
  undefined1 local_1bc0 [16];
  undefined1 auStack_1bb0 [16];
  ulong local_1ba0;
  ulong local_1b98;
  ulong local_1b90;
  ulong local_1b88;
  undefined1 local_1b80 [16];
  undefined1 auStack_1b70 [16];
  ulong local_1b60;
  ulong local_1b58;
  ulong local_1b50;
  ulong local_1b48;
  undefined1 local_1b40 [16];
  undefined1 auStack_1b30 [16];
  ulong local_1b20;
  ulong local_1b18;
  ulong local_1b10;
  ulong local_1b08;
  undefined1 local_1b00 [16];
  undefined1 local_1af0 [16];
  ulong local_1ae0;
  ulong local_1ad8;
  ulong local_1ad0;
  ulong local_1ac8;
  undefined1 local_1ac0 [16];
  undefined1 auStack_1ab0 [16];
  ulong local_1aa0;
  ulong local_1a98;
  ulong local_1a90;
  ulong local_1a88;
  undefined1 local_1a80 [16];
  undefined1 auStack_1a70 [16];
  ulong local_1a60;
  ulong local_1a58;
  ulong local_1a50;
  ulong local_1a48;
  undefined1 local_1a40 [16];
  undefined1 local_1a30 [16];
  ulong local_1a20;
  ulong local_1a18;
  ulong local_1a10;
  ulong local_1a08;
  undefined1 local_1a00 [16];
  undefined1 auStack_19f0 [16];
  undefined8 local_19e0;
  undefined8 local_19d8;
  undefined8 local_19d0;
  undefined8 local_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  ulong local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  longlong local_18c0;
  longlong lStack_18b8;
  longlong lStack_18b0;
  longlong lStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  longlong lStack_1868;
  int64_t local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  longlong local_1740;
  longlong lStack_1738;
  longlong lStack_1730;
  longlong lStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  longlong lStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  longlong local_1660;
  longlong lStack_1658;
  longlong lStack_1650;
  longlong lStack_1648;
  undefined1 local_1640 [32];
  ulong local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  ulong local_15a0;
  ulong uStack_1598;
  ulong uStack_1590;
  ulong uStack_1588;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  longlong local_1560;
  longlong lStack_1558;
  longlong lStack_1550;
  longlong lStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  long local_1520;
  long lStack_1518;
  long lStack_1510;
  long lStack_1508;
  longlong local_1500;
  longlong lStack_14f8;
  longlong lStack_14f0;
  longlong lStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [16];
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  longlong local_14a0;
  longlong lStack_1498;
  longlong lStack_1490;
  longlong lStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  longlong local_1440;
  longlong lStack_1438;
  longlong lStack_1430;
  undefined8 uStack_1428;
  longlong *local_1408;
  longlong local_1400;
  longlong lStack_13f8;
  longlong lStack_13f0;
  undefined8 uStack_13e8;
  longlong *local_13c8;
  longlong local_13c0;
  longlong lStack_13b8;
  longlong lStack_13b0;
  undefined8 uStack_13a8;
  longlong *local_1388;
  ulong local_1380;
  ulong uStack_1378;
  ulong uStack_1370;
  ulong uStack_1368;
  longlong *local_1348;
  longlong local_1340;
  longlong lStack_1338;
  longlong lStack_1330;
  undefined8 uStack_1328;
  longlong *local_1308;
  longlong local_1300;
  longlong lStack_12f8;
  longlong lStack_12f0;
  undefined8 uStack_12e8;
  longlong *local_12c8;
  longlong local_12c0;
  longlong lStack_12b8;
  longlong lStack_12b0;
  undefined8 uStack_12a8;
  longlong *local_1288;
  ulong local_1280;
  ulong uStack_1278;
  ulong uStack_1270;
  ulong uStack_1268;
  longlong *local_1248;
  longlong local_1240;
  longlong lStack_1238;
  longlong lStack_1230;
  longlong lStack_1228;
  __m256i *local_1208;
  longlong local_1200;
  longlong lStack_11f8;
  longlong lStack_11f0;
  longlong lStack_11e8;
  __m256i *local_11c8;
  longlong local_11c0;
  longlong lStack_11b8;
  longlong lStack_11b0;
  longlong lStack_11a8;
  __m256i *local_1188;
  longlong local_1180;
  longlong lStack_1178;
  longlong lStack_1170;
  longlong lStack_1168;
  __m256i *local_1148;
  longlong *local_1108;
  longlong local_1100;
  longlong lStack_10f8;
  longlong lStack_10f0;
  longlong lStack_10e8;
  __m256i *local_10c8;
  longlong local_10c0;
  longlong lStack_10b8;
  longlong lStack_10b0;
  longlong lStack_10a8;
  __m256i *local_10a0;
  longlong *local_1098;
  longlong *local_1090;
  longlong *local_1088;
  longlong *local_1080;
  longlong *local_1078;
  longlong *local_1070;
  longlong *local_1068;
  longlong *local_1060;
  __m256i *local_1058;
  __m256i *local_1050;
  __m256i *local_1048;
  __m256i *local_1040;
  longlong *local_1038;
  longlong *local_1030;
  longlong *local_1028;
  longlong *local_1020;
  __m256i *local_1018;
  __m256i *local_1010;
  __m256i *local_1008;
  __m256i *local_1000;
  undefined1 (*local_ff8) [32];
  undefined1 (*local_ff0) [32];
  undefined1 (*local_fe8) [32];
  __m256i *local_fe0;
  __m256i *local_fd8;
  __m256i *local_fd0;
  __m256i *local_fc8;
  longlong *local_fc0;
  longlong *local_fb8;
  longlong *local_fb0;
  longlong *local_fa8;
  longlong *local_fa0;
  longlong *local_f98;
  longlong *local_f90;
  longlong *local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  long local_ee0;
  long lStack_ed8;
  long lStack_ed0;
  long lStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  ulong local_ea0;
  ulong uStack_e98;
  ulong uStack_e90;
  ulong uStack_e88;
  int64_t local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  ulong local_e60;
  ulong uStack_e58;
  ulong uStack_e50;
  ulong uStack_e48;
  long local_e40;
  long lStack_e38;
  long lStack_e30;
  long lStack_e28;
  long local_e20;
  long lStack_e18;
  long lStack_e10;
  long lStack_e08;
  long local_e00;
  long lStack_df8;
  long lStack_df0;
  long lStack_de8;
  long local_de0;
  long lStack_dd8;
  long lStack_dd0;
  long lStack_dc8;
  ulong local_dc0;
  ulong uStack_db8;
  ulong uStack_db0;
  ulong uStack_da8;
  longlong local_da0;
  longlong lStack_d98;
  longlong lStack_d90;
  longlong lStack_d88;
  long local_d80;
  long lStack_d78;
  long lStack_d70;
  long lStack_d68;
  long local_d60;
  long lStack_d58;
  long lStack_d50;
  long lStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  longlong local_d20;
  longlong lStack_d18;
  longlong lStack_d10;
  longlong lStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  long local_be0;
  long lStack_bd8;
  long lStack_bd0;
  long lStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [32];
  long local_b80;
  long lStack_b78;
  long lStack_b70;
  long lStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  longlong lStack_b28;
  long local_b20;
  long lStack_b18;
  long lStack_b10;
  long lStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [32];
  long local_ac0;
  long lStack_ab8;
  long lStack_ab0;
  long lStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  longlong lStack_a68;
  long local_a60;
  long lStack_a58;
  long lStack_a50;
  long lStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [32];
  long local_a00;
  long lStack_9f8;
  long lStack_9f0;
  long lStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  longlong lStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong lStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  longlong local_4a0;
  longlong lStack_498;
  longlong lStack_490;
  longlong lStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong lStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  longlong local_440;
  longlong lStack_438;
  longlong lStack_430;
  longlong lStack_428;
  longlong local_420;
  longlong lStack_418;
  longlong lStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  longlong lStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  longlong lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  longlong lStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  long local_180;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  undefined1 local_160 [32];
  long local_140;
  long lStack_138;
  long lStack_130;
  long lStack_128;
  undefined1 local_120 [32];
  long local_100;
  long lStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  long local_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  
  local_1f2c = 0;
  local_1f30 = 0;
  local_1f34 = 0;
  local_1f38 = 0;
  local_1f3c = 0;
  local_1f40 = 0;
  local_1f48 = 0;
  local_1f4c = 0;
  local_1f50 = 0;
  local_1f54 = 0;
  local_1f58 = 0;
  local_1f60 = 0;
  local_1f68 = 0;
  local_1f70 = 0;
  local_1f78 = (__m256i *)0x0;
  local_1f80 = (__m256i *)0x0;
  local_1f88 = (__m256i *)0x0;
  local_1f90 = (__m256i *)0x0;
  local_1f98 = (longlong *)0x0;
  local_1fa0 = (longlong *)0x0;
  local_1fa8 = (longlong *)0x0;
  local_1fb0 = (longlong *)0x0;
  local_1fb8 = (__m256i *)0x0;
  local_1fc0 = (__m256i *)0x0;
  local_1fc8 = (__m256i *)0x0;
  local_1fd0 = (__m256i *)0x0;
  local_1fd8 = (__m256i *)0x0;
  local_1fe0 = (__m256i *)0x0;
  local_1fe8 = (int64_t *)0x0;
  local_2048 = 0;
  local_2050 = 0;
  local_20a8 = 0;
  local_20b0 = 0;
  local_20b8 = 0;
  local_20c0 = 0;
  local_2248 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_64","profile")
    ;
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_64",
            "profile->matrix");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_64","s2");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_64",
            "s2Len");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_64",
            "open");
    local_1f08 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_64","gap"
           );
    local_1f08 = (parasail_result_t *)0x0;
  }
  else {
    local_1f2c = 0;
    local_1f30 = 0;
    local_1f34 = 0;
    local_1f38 = *(int *)(in_RDI + 8);
    local_1f3c = local_1f38 + -1;
    local_1f40 = in_EDX + -1;
    local_1f48 = *(long *)(in_RDI + 0x10);
    local_1f4c = 4;
    local_1f50 = (local_1f38 + 3) / 4;
    local_1f54 = (local_1f38 + -1) % local_1f50;
    local_1f58 = ~((local_1f38 + -1) / local_1f50) + 4;
    local_1f60 = *(long *)(in_RDI + 0x60);
    local_1f68 = *(long *)(in_RDI + 0x68);
    local_1f70 = *(long *)(in_RDI + 0x70);
    local_1ea8 = (ulong)in_ECX;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_1ea8;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_1ea8;
    local_1d00 = vpunpcklqdq_avx(auVar73,auVar81);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_1ea8;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = local_1ea8;
    auStack_1cf0 = vpunpcklqdq_avx(auVar82,auVar94);
    local_2020 = local_1d00._0_8_;
    uStack_2018 = local_1d00._8_8_;
    uStack_2010 = auStack_1cf0._0_8_;
    uStack_2008 = auStack_1cf0._8_8_;
    local_1eb0 = (ulong)in_R8D;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_1eb0;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_1eb0;
    auVar73 = vpunpcklqdq_avx(auVar74,auVar83);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_1eb0;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = local_1eb0;
    auVar74 = vpunpcklqdq_avx(auVar75,auVar95);
    local_1cc0._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar74;
    local_1cc0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
    if (-in_ECX < *(int *)(local_1f48 + 0x20)) {
      lVar69 = (long)in_ECX;
    }
    else {
      lVar69 = -(long)*(int *)(local_1f48 + 0x20);
    }
    local_2200 = lVar69 + 0x8000000000000001;
    local_2050 = 0x7ffffffffffffffe - (long)*(int *)(local_1f48 + 0x1c);
    local_1ea0._8_8_ = SUB328(ZEXT832(0),4);
    local_2080 = 0;
    uStack_2078 = local_1ea0._8_8_;
    uStack_2070 = 0;
    uStack_2068 = 0;
    local_1eb8 = 1;
    local_1c48 = 1;
    local_1c50 = 1;
    local_1c58 = 1;
    local_1c60 = 1;
    local_1c80 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_1c70 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_20a0 = local_1c80._0_8_;
    uStack_2098 = local_1c80._8_8_;
    uStack_2090 = auStack_1c70._0_8_;
    uStack_2088 = auStack_1c70._8_8_;
    local_20b0 = 0;
    local_20b8 = 0;
    local_20c0 = 0;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_2200;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = local_2200;
    local_1c40 = vpunpcklqdq_avx(auVar76,auVar84);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = local_2200;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = local_2200;
    auStack_1c30 = vpunpcklqdq_avx(auVar85,auVar96);
    local_20e0 = local_1c40._0_8_;
    uStack_20d8 = local_1c40._8_8_;
    uStack_20d0 = auStack_1c30._0_8_;
    uStack_20c8 = auStack_1c30._8_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_2050;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = local_2050;
    local_1c00 = vpunpcklqdq_avx(auVar77,auVar86);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_2050;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_2050;
    auStack_1bf0 = vpunpcklqdq_avx(auVar87,auVar97);
    local_2100 = local_1c00._0_8_;
    uStack_20f8 = local_1c00._8_8_;
    uStack_20f0 = auStack_1bf0._0_8_;
    uStack_20e8 = auStack_1bf0._8_8_;
    local_2120 = local_1c00._0_8_;
    uStack_2118 = local_1c00._8_8_;
    uStack_2110 = auStack_1bf0._0_8_;
    uStack_2108 = auStack_1bf0._8_8_;
    local_2140 = local_1c40._0_8_;
    uStack_2138 = local_1c40._8_8_;
    uStack_2130 = auStack_1c30._0_8_;
    uStack_2128 = auStack_1c30._8_8_;
    local_2160._16_8_ = auStack_1c30._0_8_;
    local_2160._0_16_ = local_1c40;
    local_2160._24_8_ = auStack_1c30._8_8_;
    local_2180._16_8_ = auStack_1c30._0_8_;
    local_2180._0_16_ = local_1c40;
    local_2180._24_8_ = auStack_1c30._8_8_;
    local_21a0._16_8_ = auStack_1c30._0_8_;
    local_21a0._0_16_ = local_1c40;
    local_21a0._24_8_ = auStack_1c30._8_8_;
    local_21c0._16_8_ = auStack_1c30._0_8_;
    local_21c0._0_16_ = local_1c40;
    local_21c0._24_8_ = auStack_1c30._8_8_;
    local_1ed0 = (ulong)local_1f58;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_1ed0;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_1ed0;
    local_1bc0 = vpunpcklqdq_avx(auVar78,auVar88);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_1ed0;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = local_1ed0;
    auStack_1bb0 = vpunpcklqdq_avx(auVar89,auVar98);
    local_19c8 = 0;
    local_19d0 = 1;
    local_19d8 = 2;
    local_19e0 = 3;
    local_1a00 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_19f0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_1d20 = local_1bc0._0_8_;
    lStack_1d18 = local_1bc0._8_8_;
    lStack_1d10 = auStack_1bb0._0_8_;
    lStack_1d08 = auStack_1bb0._8_8_;
    local_1d40 = local_1a00._0_8_;
    lStack_1d38 = local_1a00._8_8_;
    lStack_1d30 = auStack_19f0._0_8_;
    lStack_1d28 = auStack_19f0._8_8_;
    local_21e0 = -(ulong)(local_1bc0._0_8_ == local_1a00._0_8_);
    lStack_21d8 = -(ulong)(local_1bc0._8_8_ == local_1a00._8_8_);
    lStack_21d0 = -(ulong)(auStack_1bb0._0_8_ == auStack_19f0._0_8_);
    lStack_21c8 = -(ulong)(auStack_1bb0._8_8_ == auStack_19f0._8_8_);
    uStack_21f8 = local_1ea0._8_8_;
    uStack_21f0 = 0;
    uStack_21e8 = 0;
    local_1ed8 = (ulong)local_1f50;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_1ed8;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = local_1ed8;
    local_1b80 = vpunpcklqdq_avx(auVar79,auVar90);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_1ed8;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_1ed8;
    auStack_1b70 = vpunpcklqdq_avx(auVar91,auVar99);
    auVar8._16_16_ = auStack_1b70;
    auVar8._0_16_ = local_1b80;
    local_1ee0 = (ulong)local_1f50;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_1ee0;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_1ee0;
    local_1b40 = vpunpcklqdq_avx(auVar92,auVar100);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_1ee0;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = local_1ee0;
    auStack_1b30 = vpunpcklqdq_avx(auVar101,auVar106);
    auVar7._16_16_ = auStack_1b30;
    auVar7._0_16_ = local_1b40;
    local_1ee8 = (ulong)local_1f50;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_1ee8;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_1ee8;
    local_1b00 = vpunpcklqdq_avx(auVar93,auVar107);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = local_1ee8;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_1ee8;
    local_1af0 = vpunpcklqdq_avx(auVar108,auVar112);
    auVar7 = vperm2i128_avx2(ZEXT1632(local_1b00),auVar7,0x28);
    local_2240 = vpalignr_avx2(auVar8,auVar7,8);
    local_1ef0 = (ulong)(-local_1f50 * in_R8D);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_1ef0;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_1ef0;
    local_1ac0 = vpunpcklqdq_avx(auVar80,auVar102);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_1ef0;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_1ef0;
    auStack_1ab0 = vpunpcklqdq_avx(auVar103,auVar109);
    auVar2._16_16_ = auStack_1ab0;
    auVar2._0_16_ = local_1ac0;
    local_1ef8 = (ulong)(-local_1f50 * in_R8D);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = local_1ef8;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_1ef8;
    local_1a80 = vpunpcklqdq_avx(auVar104,auVar110);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_1ef8;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_1ef8;
    auStack_1a70 = vpunpcklqdq_avx(auVar111,auVar113);
    auVar3._16_16_ = auStack_1a70;
    auVar3._0_16_ = local_1a80;
    local_1f00 = (ulong)(-local_1f50 * in_R8D);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_1f00;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_1f00;
    local_1a40 = vpunpcklqdq_avx(auVar105,auVar114);
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_1f00;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_1f00;
    local_1a30 = vpunpcklqdq_avx(auVar115,auVar116);
    auVar7 = vperm2i128_avx2(ZEXT1632(local_1a40),auVar3,0x28);
    local_1640 = vpalignr_avx2(auVar2,auVar7,8);
    uStack_1618 = local_1ea0._8_8_;
    uStack_1610 = 0;
    uStack_1608 = 0;
    local_2220 = vpaddq_avx2(ZEXT1632(CONCAT88(local_1ea0._8_8_,local_2200)),local_1640);
    local_20a8 = local_2200;
    local_2048 = local_2200;
    local_1f28 = in_R9D;
    local_1f24 = in_R8D;
    local_1f20 = in_ECX;
    local_1f1c = in_EDX;
    local_1f18 = in_RSI;
    local_1ec8 = local_2050;
    local_1ec0 = local_2200;
    local_1ea0 = ZEXT832(0) << 0x20;
    local_1ce0 = local_1ea8;
    local_1cd8 = local_1ea8;
    local_1cd0 = local_1ea8;
    local_1cc8 = local_1ea8;
    local_1ca0 = local_1eb0;
    local_1c98 = local_1eb0;
    local_1c90 = local_1eb0;
    local_1c88 = local_1eb0;
    local_1c20 = local_2200;
    local_1c18 = local_2200;
    local_1c10 = local_2200;
    local_1c08 = local_2200;
    local_1be0 = local_2050;
    local_1bd8 = local_2050;
    local_1bd0 = local_2050;
    local_1bc8 = local_2050;
    local_1ba0 = local_1ed0;
    local_1b98 = local_1ed0;
    local_1b90 = local_1ed0;
    local_1b88 = local_1ed0;
    local_1b60 = local_1ed8;
    local_1b58 = local_1ed8;
    local_1b50 = local_1ed8;
    local_1b48 = local_1ed8;
    local_1b20 = local_1ee0;
    local_1b18 = local_1ee0;
    local_1b10 = local_1ee0;
    local_1b08 = local_1ee0;
    local_1ae0 = local_1ee8;
    local_1ad8 = local_1ee8;
    local_1ad0 = local_1ee8;
    local_1ac8 = local_1ee8;
    local_1aa0 = local_1ef0;
    local_1a98 = local_1ef0;
    local_1a90 = local_1ef0;
    local_1a88 = local_1ef0;
    local_1a60 = local_1ef8;
    local_1a58 = local_1ef8;
    local_1a50 = local_1ef8;
    local_1a48 = local_1ef8;
    local_1a20 = local_1f00;
    local_1a18 = local_1f00;
    local_1a10 = local_1f00;
    local_1a08 = local_1f00;
    local_1620 = local_2200;
    local_2040 = local_1cc0._0_16_;
    auStack_2030 = local_1cc0._16_16_;
    local_2248 = parasail_result_new_stats();
    if (local_2248 == (parasail_result_t *)0x0) {
      local_1f08 = (parasail_result_t *)0x0;
    }
    else {
      local_2248->flag = local_2248->flag | 0x4810402;
      uVar9 = 0;
      if (local_1f28 != 0) {
        uVar9 = 8;
      }
      local_2248->flag = uVar9 | local_2248->flag;
      uVar9 = 0;
      if (in_stack_00000008 != 0) {
        uVar9 = 0x10;
      }
      local_2248->flag = uVar9 | local_2248->flag;
      uVar9 = 0;
      if (s1_end != 0) {
        uVar9 = 0x4000;
      }
      local_2248->flag = uVar9 | local_2248->flag;
      uVar9 = 0;
      if (s2_beg != 0) {
        uVar9 = 0x8000;
      }
      local_2248->flag = uVar9 | local_2248->flag;
      local_1f78 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1f80 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1f88 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1f90 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1f98 = *parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fa0 = *parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fa8 = *parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fb0 = *parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fb8 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fc0 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fc8 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fd0 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fd8 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fe0 = parasail_memalign___m256i(0x20,(long)local_1f50);
      local_1fe8 = parasail_memalign_int64_t(0x20,(long)(local_1f1c + 1));
      if (local_1f78 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1f80 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1f88 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1f90 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1f98 == (longlong *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fa0 == (longlong *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fa8 == (longlong *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fb0 == (longlong *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fb8 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fc0 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fc8 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fd0 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fd8 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fe0 == (__m256i *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else if (local_1fe8 == (int64_t *)0x0) {
        local_1f08 = (parasail_result_t *)0x0;
      }
      else {
        alVar26[1]._0_4_ = in_stack_ffffffffffffd740;
        alVar26[0] = in_stack_ffffffffffffd738;
        alVar26[1]._4_4_ = in_stack_ffffffffffffd744;
        alVar26[2] = in_stack_ffffffffffffd748;
        alVar26[3]._0_4_ = in_stack_ffffffffffffd750;
        alVar26[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,alVar26,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        alVar27[1]._0_4_ = in_stack_ffffffffffffd740;
        alVar27[0] = in_stack_ffffffffffffd738;
        alVar27[1]._4_4_ = in_stack_ffffffffffffd744;
        alVar27[2] = in_stack_ffffffffffffd748;
        alVar27[3]._0_4_ = in_stack_ffffffffffffd750;
        alVar27[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,alVar27,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        alVar28[1]._0_4_ = in_stack_ffffffffffffd740;
        alVar28[0] = in_stack_ffffffffffffd738;
        alVar28[1]._4_4_ = in_stack_ffffffffffffd744;
        alVar28[2] = in_stack_ffffffffffffd748;
        alVar28[3]._0_4_ = in_stack_ffffffffffffd750;
        alVar28[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,alVar28,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        alVar29[1]._0_4_ = in_stack_ffffffffffffd740;
        alVar29[0] = in_stack_ffffffffffffd738;
        alVar29[1]._4_4_ = in_stack_ffffffffffffd744;
        alVar29[2] = in_stack_ffffffffffffd748;
        alVar29[3]._0_4_ = in_stack_ffffffffffffd750;
        alVar29[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,alVar29,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        alVar30[1]._0_4_ = in_stack_ffffffffffffd740;
        alVar30[0] = in_stack_ffffffffffffd738;
        alVar30[1]._4_4_ = in_stack_ffffffffffffd744;
        alVar30[2] = in_stack_ffffffffffffd748;
        alVar30[3]._0_4_ = in_stack_ffffffffffffd750;
        alVar30[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,alVar30,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        c[1]._0_4_ = in_stack_ffffffffffffd740;
        c[0] = in_stack_ffffffffffffd738;
        c[1]._4_4_ = in_stack_ffffffffffffd744;
        c[2] = in_stack_ffffffffffffd748;
        c[3]._0_4_ = in_stack_ffffffffffffd750;
        c[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,c,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        c_00[1]._0_4_ = in_stack_ffffffffffffd740;
        c_00[0] = in_stack_ffffffffffffd738;
        c_00[1]._4_4_ = in_stack_ffffffffffffd744;
        c_00[2] = in_stack_ffffffffffffd748;
        c_00[3]._0_4_ = in_stack_ffffffffffffd750;
        c_00[3]._4_4_ = in_stack_ffffffffffffd754;
        parasail_memset___m256i
                  (in_stack_ffffffffffffd770,c_00,
                   CONCAT44(in_stack_ffffffffffffd734,in_stack_ffffffffffffd730));
        local_1460 = local_2080;
        uStack_1458 = uStack_2078;
        uStack_1450 = uStack_2070;
        uStack_1448 = uStack_2068;
        local_1480 = local_2020;
        uStack_1478 = uStack_2018;
        uStack_1470 = uStack_2010;
        uStack_1468 = uStack_2008;
        auVar5._8_8_ = uStack_2078;
        auVar5._0_8_ = local_2080;
        auVar5._16_8_ = uStack_2070;
        auVar5._24_8_ = uStack_2068;
        auVar4._8_8_ = uStack_2018;
        auVar4._0_8_ = local_2020;
        auVar4._16_8_ = uStack_2010;
        auVar4._24_8_ = uStack_2008;
        local_2280 = vpsubq_avx2(auVar5,auVar4);
        local_22a0._8_8_ = uStack_2098;
        local_22a0._0_8_ = local_20a0;
        local_22a0._16_8_ = uStack_2090;
        local_22a0._24_8_ = uStack_2088;
        local_1f2c = local_1f50;
        while (local_1f2c = local_1f2c + -1, -1 < local_1f2c) {
          local_10a0 = local_1fd8 + local_1f2c;
          local_10c0 = local_2280._0_8_;
          lStack_10b8 = local_2280._8_8_;
          lStack_10b0 = local_2280._16_8_;
          lStack_10a8 = local_2280._24_8_;
          (*local_10a0)[0] = local_2280._0_8_;
          (*local_10a0)[1] = local_2280._8_8_;
          (*local_10a0)[2] = local_2280._16_8_;
          (*local_10a0)[3] = local_2280._24_8_;
          local_10c8 = local_1fe0 + local_1f2c;
          local_1100 = local_22a0._0_8_;
          lStack_10f8 = local_22a0._8_8_;
          lStack_10f0 = local_22a0._16_8_;
          lStack_10e8 = local_22a0._24_8_;
          (*local_10c8)[0] = local_22a0._0_8_;
          (*local_10c8)[1] = local_22a0._8_8_;
          (*local_10c8)[2] = local_22a0._16_8_;
          (*local_10c8)[3] = local_22a0._24_8_;
          local_14a0 = local_2280._0_8_;
          lStack_1498 = local_2280._8_8_;
          lStack_1490 = local_2280._16_8_;
          lStack_1488 = local_2280._24_8_;
          uStack_14b0 = auStack_2030._0_8_;
          uStack_14a8 = auStack_2030._8_8_;
          auVar45._16_8_ = auStack_2030._0_8_;
          auVar45._0_16_ = local_2040;
          auVar45._24_8_ = auStack_2030._8_8_;
          local_2280 = vpsubq_avx2(local_2280,auVar45);
          local_1660 = local_22a0._0_8_;
          lStack_1658 = local_22a0._8_8_;
          lStack_1650 = local_22a0._16_8_;
          lStack_1648 = local_22a0._24_8_;
          local_1680 = local_20a0;
          uStack_1678 = uStack_2098;
          uStack_1670 = uStack_2090;
          uStack_1668 = uStack_2088;
          auVar6._8_8_ = uStack_2098;
          auVar6._0_8_ = local_20a0;
          auVar6._16_8_ = uStack_2090;
          auVar6._24_8_ = uStack_2088;
          local_22a0 = vpaddq_avx2(local_22a0,auVar6);
          local_14c0 = local_2040;
        }
        local_22a4 = 0;
        local_1f2c = 0;
        while( true ) {
          if (local_1f50 <= local_1f2c) break;
          for (local_22a8 = 0; local_22a8 < local_1f4c; local_22a8 = local_22a8 + 1) {
            if (local_1f28 == 0) {
              iVar117 = -(local_1f24 * (local_22a8 * local_1f50 + local_1f2c)) - local_1f20;
            }
            else {
              iVar117 = 0;
            }
            uVar70 = (ulong)iVar117;
            if ((long)uVar70 < -0x8000000000000000) {
              uVar70 = 0x8000000000000000;
            }
            local_22e0[local_22a8] = uVar70;
          }
          local_1108 = local_1f98 + (long)local_22a4 * 4;
          *local_1108 = local_22e0[0];
          local_1108[1] = local_22e0[1];
          local_1108[2] = local_22e0[2];
          local_1108[3] = local_22e0[3];
          local_22a4 = local_22a4 + 1;
          local_1f2c = local_1f2c + 1;
        }
        *local_1fe8 = 0;
        for (local_1f2c = 1; local_1f2c <= local_1f1c; local_1f2c = local_1f2c + 1) {
          if (s1_end == 0) {
            iVar117 = -(local_1f24 * (local_1f2c + -1)) - local_1f20;
          }
          else {
            iVar117 = 0;
          }
          lVar69 = (long)iVar117;
          if (lVar69 < -0x8000000000000000) {
            lVar69 = -0x8000000000000000;
          }
          local_1fe8[local_1f2c] = lVar69;
        }
        for (local_1f30 = 0; local_1f30 < local_1f1c; local_1f30 = local_1f30 + 1) {
          local_f88 = local_1f98 + (long)(local_1f50 + -1) * 4;
          local_f90 = local_1fa0 + (long)(local_1f50 + -1) * 4;
          local_f98 = local_1fa8 + (long)(local_1f50 + -1) * 4;
          local_fa0 = local_1fb0 + (long)(local_1f50 + -1) * 4;
          auVar7 = vpermq_avx2(*(undefined1 (*) [32])local_f88,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(*(undefined1 (*) [32])local_f90,0x90);
          local_25c0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(*(undefined1 (*) [32])local_f98,0x90);
          local_25e0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(*(undefined1 (*) [32])local_fa0,0x90);
          local_2600 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          local_25a0 = vpblendd_avx2(auVar7,ZEXT832((ulong)local_1fe8[local_1f30]),3);
          lVar69 = local_1f60 +
                   (long)(*(int *)(*(long *)(local_1f48 + 0x10) +
                                  (ulong)*(byte *)(local_1f18 + local_1f30) * 4) * local_1f50) *
                   0x20;
          lVar71 = local_1f68 +
                   (long)(*(int *)(*(long *)(local_1f48 + 0x10) +
                                  (ulong)*(byte *)(local_1f18 + local_1f30) * 4) * local_1f50) *
                   0x20;
          lVar72 = local_1f70 +
                   (long)(*(int *)(*(long *)(local_1f48 + 0x10) +
                                  (ulong)*(byte *)(local_1f18 + local_1f30) * 4) * local_1f50) *
                   0x20;
          local_1500 = (*local_1fd8)[0];
          lStack_14f8 = (*local_1fd8)[1];
          lStack_14f0 = (*local_1fd8)[2];
          lStack_14e8 = (*local_1fd8)[3];
          local_14e0 = local_20e0;
          uStack_14d8 = uStack_20d8;
          uStack_14d0 = uStack_20d0;
          uStack_14c8 = uStack_20c8;
          auVar44._8_8_ = uStack_20d8;
          auVar44._0_8_ = local_20e0;
          auVar44._16_8_ = uStack_20d0;
          auVar44._24_8_ = uStack_20c8;
          local_23e0 = vpsubq_avx2(auVar44,(undefined1  [32])*local_1fd8);
          local_2460._8_8_ = uStack_20d8;
          local_2460._0_8_ = local_20e0;
          local_2460._16_8_ = uStack_20d0;
          local_2460._24_8_ = uStack_20c8;
          local_24c0._8_8_ = uStack_2078;
          local_24c0._0_8_ = local_2080;
          local_24c0._16_8_ = uStack_2070;
          local_24c0._24_8_ = uStack_2068;
          local_24e0._8_8_ = uStack_2078;
          local_24e0._0_8_ = local_2080;
          local_24e0._16_8_ = uStack_2070;
          local_24e0._24_8_ = uStack_2068;
          local_2500._8_8_ = uStack_2078;
          local_2500._0_8_ = local_2080;
          local_2500._16_8_ = uStack_2070;
          local_2500._24_8_ = uStack_2068;
          local_1f2c = 0;
          while( true ) {
            if (local_1f50 <= local_1f2c) break;
            local_fa8 = local_1f98 + (long)local_1f2c * 4;
            local_1520 = *local_fa8;
            lStack_1518 = local_fa8[1];
            lStack_1510 = local_fa8[2];
            lStack_1508 = local_fa8[3];
            auVar45 = *(undefined1 (*) [32])local_fa8;
            local_fb0 = local_1fa0 + (long)local_1f2c * 4;
            auVar62 = *(undefined1 (*) [24])local_fb0;
            uVar10 = *(undefined8 *)*(undefined1 (*) [24])(local_fb0 + 3);
            auVar36 = *(undefined1 (*) [32])local_fb0;
            auVar5 = *(undefined1 (*) [32])local_fb0;
            local_fb8 = local_1fa8 + (long)local_1f2c * 4;
            auVar63 = *(undefined1 (*) [24])local_fb8;
            uVar11 = *(undefined8 *)*(undefined1 (*) [24])(local_fb8 + 3);
            auVar59 = *(undefined1 (*) [32])local_fb8;
            auVar6 = *(undefined1 (*) [32])local_fb8;
            local_fc0 = local_1fb0 + (long)local_1f2c * 4;
            auVar64 = *(undefined1 (*) [24])local_fc0;
            uVar12 = *(undefined8 *)*(undefined1 (*) [24])(local_fc0 + 3);
            auVar58 = *(undefined1 (*) [32])local_fc0;
            auVar44 = *(undefined1 (*) [32])local_fc0;
            local_fc8 = local_1f78 + local_1f2c;
            local_1560 = (*local_fc8)[0];
            lStack_1558 = (*local_fc8)[1];
            lStack_1550 = (*local_fc8)[2];
            lStack_1548 = (*local_fc8)[3];
            local_fd0 = local_1f80 + local_1f2c;
            auVar65 = *(undefined1 (*) [24])*local_fd0;
            lVar122 = (*local_fd0)[3];
            alVar27 = *local_fd0;
            local_fd8 = local_1f88 + local_1f2c;
            auVar66 = *(undefined1 (*) [24])*local_fd8;
            lVar123 = (*local_fd8)[3];
            alVar28 = *local_fd8;
            local_fe0 = local_1f90 + local_1f2c;
            auVar67 = *(undefined1 (*) [24])*local_fe0;
            lVar124 = (*local_fe0)[3];
            alVar29 = *local_fe0;
            local_fe8 = (undefined1 (*) [32])(lVar69 + (long)local_1f2c * 0x20);
            uVar13 = *(undefined8 *)*local_fe8;
            uVar14 = *(undefined8 *)(*local_fe8 + 8);
            uVar15 = *(undefined8 *)(*local_fe8 + 0x10);
            uVar16 = *(undefined8 *)(*local_fe8 + 0x18);
            auVar2 = *local_fe8;
            local_ff0 = (undefined1 (*) [32])(lVar71 + (long)local_1f2c * 0x20);
            uVar17 = *(undefined8 *)*local_ff0;
            uVar18 = *(undefined8 *)(*local_ff0 + 8);
            uVar19 = *(undefined8 *)(*local_ff0 + 0x10);
            uVar20 = *(undefined8 *)(*local_ff0 + 0x18);
            auVar3 = *local_ff0;
            local_ff8 = (undefined1 (*) [32])(lVar72 + (long)local_1f2c * 0x20);
            uVar21 = *(undefined8 *)*local_ff8;
            uVar22 = *(undefined8 *)(*local_ff8 + 8);
            uVar23 = *(undefined8 *)(*local_ff8 + 0x10);
            uVar24 = *(undefined8 *)(*local_ff8 + 0x18);
            auVar4 = *local_ff8;
            local_1000 = local_1fd8 + local_1f2c;
            auVar68 = *(undefined1 (*) [24])*local_1000;
            lVar119 = (*local_1000)[3];
            alVar30 = *local_1000;
            local_1008 = local_1fe0 + local_1f2c;
            lVar120 = (*local_1008)[0];
            lVar121 = (*local_1008)[1];
            lVar118 = (*local_1008)[2];
            lVar25 = (*local_1008)[3];
            alVar26 = *local_1008;
            local_1540 = local_2020;
            uStack_1538 = uStack_2018;
            uStack_1530 = uStack_2010;
            uStack_1528 = uStack_2008;
            auVar43._8_8_ = uStack_2018;
            auVar43._0_8_ = local_2020;
            auVar43._16_8_ = uStack_2010;
            auVar43._24_8_ = uStack_2008;
            auVar7 = vpsubq_avx2(*(undefined1 (*) [32])local_fa8,auVar43);
            auVar42._16_8_ = auStack_2030._0_8_;
            auVar42._0_16_ = local_2040;
            auVar42._24_8_ = auStack_2030._8_8_;
            auVar8 = vpsubq_avx2((undefined1  [32])*local_fc8,auVar42);
            local_2360 = auVar7._0_8_;
            lStack_2358 = auVar7._8_8_;
            lStack_2350 = auVar7._16_8_;
            lStack_2348 = auVar7._24_8_;
            local_2340 = auVar8._0_8_;
            uStack_2338 = auVar8._8_8_;
            uStack_2330 = auVar8._16_8_;
            uStack_2328 = auVar8._24_8_;
            local_d20 = local_2360;
            lStack_d18 = lStack_2358;
            lStack_d10 = lStack_2350;
            lStack_d08 = lStack_2348;
            local_d40 = local_2340;
            uStack_d38 = uStack_2338;
            uStack_d30 = uStack_2330;
            uStack_d28 = uStack_2328;
            auVar7 = vpcmpgtq_avx2(auVar7,auVar8);
            a[1] = in_stack_ffffffffffffd7a0;
            a[0] = in_stack_ffffffffffffd798;
            a[2] = in_stack_ffffffffffffd7a8;
            a[3] = in_stack_ffffffffffffd7b0;
            b[1] = in_stack_ffffffffffffd780;
            b[0] = in_stack_ffffffffffffd778;
            b[2] = in_stack_ffffffffffffd788;
            b[3] = in_stack_ffffffffffffd790;
            local_1580 = local_2040;
            auStack_1570 = auStack_2030;
            _mm256_max_epi64_rpl(a,b);
            local_2380 = auVar65._0_8_;
            lStack_2378 = auVar65._8_8_;
            lStack_2370 = auVar65._16_8_;
            local_2540._0_8_ = auVar62._0_8_;
            local_2540._8_8_ = auVar62._8_8_;
            local_2540._16_8_ = auVar62._16_8_;
            local_26e0._0_8_ = auVar7._0_8_;
            local_26e0._8_8_ = auVar7._8_8_;
            uStack_26d0 = auVar7._16_8_;
            uStack_26c8 = auVar7._24_8_;
            local_1e0 = local_2380;
            uStack_1d8 = lStack_2378;
            uStack_1d0 = lStack_2370;
            local_200 = local_2540._0_8_;
            uStack_1f8 = local_2540._8_8_;
            uStack_1f0 = local_2540._16_8_;
            local_220 = local_26e0._0_8_;
            uStack_218 = local_26e0._8_8_;
            uStack_210 = uStack_26d0;
            uStack_208 = uStack_26c8;
            auVar5 = vpblendvb_avx2((undefined1  [32])alVar27,auVar5,auVar7);
            local_23a0 = auVar66._0_8_;
            lStack_2398 = auVar66._8_8_;
            lStack_2390 = auVar66._16_8_;
            local_2560._0_8_ = auVar63._0_8_;
            local_2560._8_8_ = auVar63._8_8_;
            local_2560._16_8_ = auVar63._16_8_;
            local_240 = local_23a0;
            uStack_238 = lStack_2398;
            uStack_230 = lStack_2390;
            local_260 = local_2560._0_8_;
            uStack_258 = local_2560._8_8_;
            uStack_250 = local_2560._16_8_;
            local_280 = local_26e0._0_8_;
            uStack_278 = local_26e0._8_8_;
            uStack_270 = uStack_26d0;
            uStack_268 = uStack_26c8;
            auVar6 = vpblendvb_avx2((undefined1  [32])alVar28,auVar6,auVar7);
            local_23c0 = auVar67._0_8_;
            lStack_23b8 = auVar67._8_8_;
            lStack_23b0 = auVar67._16_8_;
            local_2580._0_8_ = auVar64._0_8_;
            local_2580._8_8_ = auVar64._8_8_;
            local_2580._16_8_ = auVar64._16_8_;
            local_2a0 = local_23c0;
            uStack_298 = lStack_23b8;
            uStack_290 = lStack_23b0;
            local_2c0 = local_2580._0_8_;
            uStack_2b8 = local_2580._8_8_;
            uStack_2b0 = local_2580._16_8_;
            local_2e0 = local_26e0._0_8_;
            uStack_2d8 = local_26e0._8_8_;
            uStack_2d0 = uStack_26d0;
            uStack_2c8 = uStack_26c8;
            auVar7 = vpblendvb_avx2((undefined1  [32])alVar29,auVar44,auVar7);
            local_23c0 = auVar7._0_8_;
            lStack_23b8 = auVar7._8_8_;
            lStack_23b0 = auVar7._16_8_;
            lStack_23a8 = auVar7._24_8_;
            local_16a0 = local_23c0;
            uStack_1698 = lStack_23b8;
            uStack_1690 = lStack_23b0;
            uStack_1688 = lStack_23a8;
            local_16c0 = local_20a0;
            uStack_16b8 = uStack_2098;
            uStack_16b0 = uStack_2090;
            uStack_16a8 = uStack_2088;
            auVar38._8_8_ = uStack_2098;
            auVar38._0_8_ = local_20a0;
            auVar38._16_8_ = uStack_2090;
            auVar38._24_8_ = uStack_2088;
            auVar7 = vpaddq_avx2(auVar7,auVar38);
            local_2720 = auVar68._0_8_;
            lStack_2718 = auVar68._8_8_;
            lStack_2710 = auVar68._16_8_;
            local_16e0 = local_23e0._0_8_;
            uStack_16d8 = local_23e0._8_8_;
            uStack_16d0 = local_23e0._16_8_;
            uStack_16c8 = local_23e0._24_8_;
            local_1700 = local_2720;
            uStack_16f8 = lStack_2718;
            uStack_16f0 = lStack_2710;
            auVar8 = vpaddq_avx2(local_23e0,(undefined1  [32])alVar30);
            local_2720 = auVar8._0_8_;
            lStack_2718 = auVar8._8_8_;
            lStack_2710 = auVar8._16_8_;
            lStack_2708 = auVar8._24_8_;
            local_d60 = local_2460._0_8_;
            lStack_d58 = local_2460._8_8_;
            lStack_d50 = local_2460._16_8_;
            lStack_d48 = local_2460._24_8_;
            local_d80 = local_2720;
            lStack_d78 = lStack_2718;
            lStack_d70 = lStack_2710;
            lStack_d68 = lStack_2708;
            local_e0 = vpcmpgtq_avx2(local_2460,auVar8);
            local_1d60 = local_2460._0_8_;
            lStack_1d58 = local_2460._8_8_;
            lStack_1d50 = local_2460._16_8_;
            lStack_1d48 = local_2460._24_8_;
            local_1d80 = local_2720;
            lStack_1d78 = lStack_2718;
            lStack_1d70 = lStack_2710;
            lStack_1d68 = lStack_2708;
            local_100 = -(ulong)(local_2460._0_8_ == local_2720);
            lStack_f8 = -(ulong)(local_2460._8_8_ == lStack_2718);
            lStack_f0 = -(ulong)(local_2460._16_8_ == lStack_2710);
            lStack_e8 = -(ulong)(local_2460._24_8_ == lStack_2708);
            auVar60._8_8_ = lStack_f8;
            auVar60._0_8_ = local_100;
            auVar60._16_8_ = lStack_f0;
            auVar60._24_8_ = lStack_e8;
            auVar8 = vpor_avx2(local_e0,auVar60);
            a_00[1] = in_stack_ffffffffffffd7a0;
            a_00[0] = in_stack_ffffffffffffd798;
            a_00[2] = in_stack_ffffffffffffd7a8;
            a_00[3] = in_stack_ffffffffffffd7b0;
            b_00[1] = in_stack_ffffffffffffd780;
            b_00[0] = in_stack_ffffffffffffd778;
            b_00[2] = in_stack_ffffffffffffd788;
            b_00[3] = in_stack_ffffffffffffd790;
            lStack_16e8 = lVar119;
            uStack_2a8 = uVar12;
            lStack_288 = lVar124;
            uStack_248 = uVar11;
            lStack_228 = lVar123;
            uStack_1e8 = uVar10;
            lStack_1c8 = lVar122;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_26e0._0_8_ = auVar8._0_8_;
            local_26e0._8_8_ = auVar8._8_8_;
            uStack_26d0 = auVar8._16_8_;
            uStack_26c8 = auVar8._24_8_;
            local_300 = local_2400._0_8_;
            uStack_2f8 = local_2400._8_8_;
            uStack_2f0 = local_2400._16_8_;
            uStack_2e8 = local_2400._24_8_;
            local_320 = local_24c0._0_8_;
            uStack_318 = local_24c0._8_8_;
            uStack_310 = local_24c0._16_8_;
            uStack_308 = local_24c0._24_8_;
            local_340 = local_26e0._0_8_;
            uStack_338 = local_26e0._8_8_;
            uStack_330 = uStack_26d0;
            uStack_328 = uStack_26c8;
            local_24c0 = vpblendvb_avx2(local_2400,local_24c0,auVar8);
            local_360 = local_2420._0_8_;
            uStack_358 = local_2420._8_8_;
            uStack_350 = local_2420._16_8_;
            uStack_348 = local_2420._24_8_;
            local_380 = local_24e0._0_8_;
            uStack_378 = local_24e0._8_8_;
            uStack_370 = local_24e0._16_8_;
            uStack_368 = local_24e0._24_8_;
            local_3a0 = local_26e0._0_8_;
            uStack_398 = local_26e0._8_8_;
            uStack_390 = uStack_26d0;
            uStack_388 = uStack_26c8;
            local_24e0 = vpblendvb_avx2(local_2420,local_24e0,auVar8);
            local_1720 = local_2440._0_8_;
            uStack_1718 = local_2440._8_8_;
            uStack_1710 = local_2440._16_8_;
            uStack_1708 = local_2440._24_8_;
            local_3c0 = vpaddq_avx2(local_2440,(undefined1  [32])alVar26);
            local_3e0 = local_2500._0_8_;
            uStack_3d8 = local_2500._8_8_;
            uStack_3d0 = local_2500._16_8_;
            uStack_3c8 = local_2500._24_8_;
            local_400 = local_26e0._0_8_;
            uStack_3f8 = local_26e0._8_8_;
            uStack_3f0 = uStack_26d0;
            uStack_3e8 = uStack_26c8;
            local_2500 = vpblendvb_avx2(local_3c0,local_2500,auVar8);
            local_1760 = local_25a0._0_8_;
            uStack_1758 = local_25a0._8_8_;
            uStack_1750 = local_25a0._16_8_;
            uStack_1748 = local_25a0._24_8_;
            auVar8 = vpaddq_avx2(local_25a0,auVar2);
            local_17a0 = local_25c0._0_8_;
            uStack_1798 = local_25c0._8_8_;
            uStack_1790 = local_25c0._16_8_;
            uStack_1788 = local_25c0._24_8_;
            auVar2 = vpaddq_avx2(local_25c0,auVar3);
            local_17e0 = local_25e0._0_8_;
            uStack_17d8 = local_25e0._8_8_;
            uStack_17d0 = local_25e0._16_8_;
            uStack_17c8 = local_25e0._24_8_;
            auVar3 = vpaddq_avx2(local_25e0,auVar4);
            local_1820 = local_2600._0_8_;
            uStack_1818 = local_2600._8_8_;
            uStack_1810 = local_2600._16_8_;
            uStack_1808 = local_2600._24_8_;
            local_1840 = local_20a0;
            uStack_1838 = uStack_2098;
            uStack_1830 = uStack_2090;
            uStack_1828 = uStack_2088;
            auVar37._8_8_ = uStack_2098;
            auVar37._0_8_ = local_20a0;
            auVar37._16_8_ = uStack_2090;
            auVar37._24_8_ = uStack_2088;
            auVar4 = vpaddq_avx2(local_2600,auVar37);
            local_25a0._0_8_ = auVar8._0_8_;
            local_25a0._8_8_ = auVar8._8_8_;
            local_25a0._16_8_ = auVar8._16_8_;
            local_25a0._24_8_ = auVar8._24_8_;
            local_dc0 = local_25a0._0_8_;
            uStack_db8 = local_25a0._8_8_;
            uStack_db0 = local_25a0._16_8_;
            uStack_da8 = local_25a0._24_8_;
            auVar51._8_8_ = lStack_2358;
            auVar51._0_8_ = local_2360;
            auVar51._16_8_ = lStack_2350;
            auVar51._24_8_ = lStack_2348;
            auVar8 = vpcmpgtq_avx2(auVar51,auVar8);
            a_01[1] = in_stack_ffffffffffffd7a0;
            a_01[0] = in_stack_ffffffffffffd798;
            a_01[2] = in_stack_ffffffffffffd7a8;
            a_01[3] = in_stack_ffffffffffffd7b0;
            b_01[1] = in_stack_ffffffffffffd780;
            b_01[0] = in_stack_ffffffffffffd778;
            b_01[2] = in_stack_ffffffffffffd788;
            b_01[3] = in_stack_ffffffffffffd790;
            local_23e0._0_8_ = local_2360;
            local_23e0._8_8_ = lStack_2358;
            local_23e0._16_8_ = lStack_2350;
            local_23e0._24_8_ = lStack_2348;
            local_1800 = uVar21;
            uStack_17f8 = uVar22;
            uStack_17f0 = uVar23;
            uStack_17e8 = uVar24;
            local_17c0 = uVar17;
            uStack_17b8 = uVar18;
            uStack_17b0 = uVar19;
            uStack_17a8 = uVar20;
            local_1780 = uVar13;
            uStack_1778 = uVar14;
            uStack_1770 = uVar15;
            uStack_1768 = uVar16;
            local_1740 = lVar120;
            lStack_1738 = lVar121;
            lStack_1730 = lVar118;
            lStack_1728 = lVar25;
            local_da0 = local_2360;
            lStack_d98 = lStack_2358;
            lStack_d90 = lStack_2350;
            lStack_d88 = lStack_2348;
            _mm256_max_epi64_rpl(a_01,b_01);
            local_25c0._0_8_ = auVar2._0_8_;
            local_420 = local_25c0._0_8_;
            local_25c0._8_8_ = auVar2._8_8_;
            lStack_418 = local_25c0._8_8_;
            local_25c0._16_8_ = auVar2._16_8_;
            lStack_410 = local_25c0._16_8_;
            local_25c0._24_8_ = auVar2._24_8_;
            uStack_408 = local_25c0._24_8_;
            local_2380 = auVar5._0_8_;
            local_440 = local_2380;
            lStack_2378 = auVar5._8_8_;
            lStack_438 = lStack_2378;
            lStack_2370 = auVar5._16_8_;
            lStack_430 = lStack_2370;
            lStack_2368 = auVar5._24_8_;
            lStack_428 = lStack_2368;
            local_26e0._0_8_ = auVar8._0_8_;
            local_460 = local_26e0._0_8_;
            local_26e0._8_8_ = auVar8._8_8_;
            uStack_458 = local_26e0._8_8_;
            uStack_26d0 = auVar8._16_8_;
            uStack_450 = uStack_26d0;
            uStack_26c8 = auVar8._24_8_;
            uStack_448 = uStack_26c8;
            local_2400 = vpblendvb_avx2(auVar2,auVar5,auVar8);
            local_25e0._0_8_ = auVar3._0_8_;
            local_480 = local_25e0._0_8_;
            local_25e0._8_8_ = auVar3._8_8_;
            lStack_478 = local_25e0._8_8_;
            local_25e0._16_8_ = auVar3._16_8_;
            lStack_470 = local_25e0._16_8_;
            local_25e0._24_8_ = auVar3._24_8_;
            uStack_468 = local_25e0._24_8_;
            local_23a0 = auVar6._0_8_;
            local_4a0 = local_23a0;
            lStack_2398 = auVar6._8_8_;
            lStack_498 = lStack_2398;
            lStack_2390 = auVar6._16_8_;
            lStack_490 = lStack_2390;
            lStack_2388 = auVar6._24_8_;
            lStack_488 = lStack_2388;
            local_4c0 = local_26e0._0_8_;
            uStack_4b8 = local_26e0._8_8_;
            uStack_4b0 = uStack_26d0;
            uStack_4a8 = uStack_26c8;
            local_2420 = vpblendvb_avx2(auVar3,auVar6,auVar8);
            local_2600._0_8_ = auVar4._0_8_;
            local_4e0 = local_2600._0_8_;
            local_2600._8_8_ = auVar4._8_8_;
            lStack_4d8 = local_2600._8_8_;
            local_2600._16_8_ = auVar4._16_8_;
            lStack_4d0 = local_2600._16_8_;
            local_2600._24_8_ = auVar4._24_8_;
            uStack_4c8 = local_2600._24_8_;
            local_23c0 = auVar7._0_8_;
            local_500 = local_23c0;
            lStack_23b8 = auVar7._8_8_;
            lStack_4f8 = lStack_23b8;
            lStack_23b0 = auVar7._16_8_;
            lStack_4f0 = lStack_23b0;
            lStack_23a8 = auVar7._24_8_;
            lStack_4e8 = lStack_23a8;
            local_520 = local_26e0._0_8_;
            uStack_518 = local_26e0._8_8_;
            uStack_510 = uStack_26d0;
            uStack_508 = uStack_26c8;
            local_2440 = vpblendvb_avx2(auVar4,auVar7,auVar8);
            local_1148 = local_1f78 + local_1f2c;
            (*local_1148)[0] = local_2360;
            (*local_1148)[1] = lStack_2358;
            (*local_1148)[2] = lStack_2350;
            (*local_1148)[3] = lStack_2348;
            local_1188 = local_1f80 + local_1f2c;
            local_11c0 = local_2380;
            lStack_11b8 = lStack_2378;
            lStack_11b0 = lStack_2370;
            lStack_11a8 = lStack_2368;
            (*local_1188)[0] = local_2380;
            (*local_1188)[1] = lStack_2378;
            (*local_1188)[2] = lStack_2370;
            (*local_1188)[3] = lStack_2368;
            local_11c8 = local_1f88 + local_1f2c;
            local_1200 = local_23a0;
            lStack_11f8 = lStack_2398;
            lStack_11f0 = lStack_2390;
            lStack_11e8 = lStack_2388;
            (*local_11c8)[0] = local_23a0;
            (*local_11c8)[1] = lStack_2398;
            (*local_11c8)[2] = lStack_2390;
            (*local_11c8)[3] = lStack_2388;
            local_1208 = local_1f90 + local_1f2c;
            local_1240 = local_23c0;
            lStack_1238 = lStack_23b8;
            lStack_1230 = lStack_23b0;
            lStack_1228 = lStack_23a8;
            (*local_1208)[0] = local_23c0;
            (*local_1208)[1] = lStack_23b8;
            (*local_1208)[2] = lStack_23b0;
            (*local_1208)[3] = lStack_23a8;
            local_1248 = local_1f98 + (long)local_1f2c * 4;
            local_1280 = local_25a0._0_8_;
            uStack_1278 = local_25a0._8_8_;
            uStack_1270 = local_25a0._16_8_;
            uStack_1268 = local_25a0._24_8_;
            *local_1248 = local_25a0._0_8_;
            local_1248[1] = local_25a0._8_8_;
            local_1248[2] = local_25a0._16_8_;
            local_1248[3] = local_25a0._24_8_;
            local_1288 = local_1fa0 + (long)local_1f2c * 4;
            local_12c0 = local_25c0._0_8_;
            lStack_12b8 = local_25c0._8_8_;
            lStack_12b0 = local_25c0._16_8_;
            uStack_12a8 = local_25c0._24_8_;
            *local_1288 = local_25c0._0_8_;
            local_1288[1] = local_25c0._8_8_;
            local_1288[2] = local_25c0._16_8_;
            local_1288[3] = local_25c0._24_8_;
            local_12c8 = local_1fa8 + (long)local_1f2c * 4;
            local_1300 = local_25e0._0_8_;
            lStack_12f8 = local_25e0._8_8_;
            lStack_12f0 = local_25e0._16_8_;
            uStack_12e8 = local_25e0._24_8_;
            *local_12c8 = local_25e0._0_8_;
            local_12c8[1] = local_25e0._8_8_;
            local_12c8[2] = local_25e0._16_8_;
            local_12c8[3] = local_25e0._24_8_;
            local_1308 = local_1fb0 + (long)local_1f2c * 4;
            local_1340 = local_2600._0_8_;
            lStack_1338 = local_2600._8_8_;
            lStack_1330 = local_2600._16_8_;
            uStack_1328 = local_2600._24_8_;
            *local_1308 = local_2600._0_8_;
            local_1308[1] = local_2600._8_8_;
            local_1308[2] = local_2600._16_8_;
            local_1308[3] = local_2600._24_8_;
            local_1f2c = local_1f2c + 1;
            local_2600 = auVar58;
            local_25e0 = auVar59;
            local_25c0 = auVar36;
            local_25a0 = auVar45;
            local_1180 = local_2360;
            lStack_1178 = lStack_2358;
            lStack_1170 = lStack_2350;
            lStack_1168 = lStack_2348;
          }
          auVar7 = vpermq_avx2(local_23e0,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_2400,0x90);
          local_2400 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_2420,0x90);
          local_2420 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_2440,0x90);
          local_2440 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          iVar1 = local_1fe8[(long)local_1f30 + 1];
          local_1010 = local_1fd8;
          auVar62 = *(undefined1 (*) [24])*local_1fd8;
          lStack_1868 = (*local_1fd8)[3];
          local_1018 = local_1fe0;
          lVar122 = (*local_1fe0)[0];
          lVar123 = (*local_1fe0)[1];
          lVar124 = (*local_1fe0)[2];
          lVar119 = (*local_1fe0)[3];
          alVar26 = *local_1fe0;
          local_23e0._8_8_ = auVar7._8_8_;
          local_23e0._16_8_ = auVar7._16_8_;
          local_23e0._24_8_ = auVar7._24_8_;
          local_2720 = auVar62._0_8_;
          lStack_2718 = auVar62._8_8_;
          lStack_2710 = auVar62._16_8_;
          uStack_1858 = local_23e0._8_8_;
          uStack_1850 = local_23e0._16_8_;
          uStack_1848 = local_23e0._24_8_;
          local_1880 = local_2720;
          uStack_1878 = lStack_2718;
          uStack_1870 = lStack_2710;
          auVar36._8_8_ = local_23e0._8_8_;
          auVar36._0_8_ = iVar1;
          auVar36._16_8_ = local_23e0._16_8_;
          auVar36._24_8_ = local_23e0._24_8_;
          auVar7 = vpaddq_avx2(auVar36,(undefined1  [32])*local_1fd8);
          local_2720 = auVar7._0_8_;
          lStack_2718 = auVar7._8_8_;
          lStack_2710 = auVar7._16_8_;
          lStack_2708 = auVar7._24_8_;
          local_de0 = local_2720;
          lStack_dd8 = lStack_2718;
          lStack_dd0 = lStack_2710;
          lStack_dc8 = lStack_2708;
          local_e00 = local_2460._0_8_;
          lStack_df8 = local_2460._8_8_;
          lStack_df0 = local_2460._16_8_;
          lStack_de8 = local_2460._24_8_;
          local_120 = vpcmpgtq_avx2(auVar7,local_2460);
          local_1da0 = local_2720;
          lStack_1d98 = lStack_2718;
          lStack_1d90 = lStack_2710;
          lStack_1d88 = lStack_2708;
          local_1dc0 = local_2460._0_8_;
          lStack_1db8 = local_2460._8_8_;
          lStack_1db0 = local_2460._16_8_;
          lStack_1da8 = local_2460._24_8_;
          local_140 = -(ulong)(local_2720 == local_2460._0_8_);
          lStack_138 = -(ulong)(lStack_2718 == local_2460._8_8_);
          lStack_130 = -(ulong)(lStack_2710 == local_2460._16_8_);
          lStack_128 = -(ulong)(lStack_2708 == local_2460._24_8_);
          auVar59._8_8_ = lStack_138;
          auVar59._0_8_ = local_140;
          auVar59._16_8_ = lStack_130;
          auVar59._24_8_ = lStack_128;
          auVar7 = vpor_avx2(local_120,auVar59);
          a_02[1] = in_stack_ffffffffffffd7a0;
          a_02[0] = in_stack_ffffffffffffd798;
          a_02[2] = in_stack_ffffffffffffd7a8;
          a_02[3] = in_stack_ffffffffffffd7b0;
          b_02[1] = in_stack_ffffffffffffd780;
          b_02[0] = in_stack_ffffffffffffd778;
          b_02[2] = in_stack_ffffffffffffd788;
          b_02[3] = in_stack_ffffffffffffd790;
          local_1860 = iVar1;
          _mm256_max_epi64_rpl(a_02,b_02);
          local_26e0._0_8_ = auVar7._0_8_;
          local_26e0._8_8_ = auVar7._8_8_;
          uStack_26d0 = auVar7._16_8_;
          uStack_26c8 = auVar7._24_8_;
          local_540 = local_24c0._0_8_;
          uStack_538 = local_24c0._8_8_;
          uStack_530 = local_24c0._16_8_;
          uStack_528 = local_24c0._24_8_;
          local_560 = local_2400._0_8_;
          uStack_558 = local_2400._8_8_;
          uStack_550 = local_2400._16_8_;
          uStack_548 = local_2400._24_8_;
          local_580 = local_26e0._0_8_;
          uStack_578 = local_26e0._8_8_;
          uStack_570 = uStack_26d0;
          uStack_568 = uStack_26c8;
          local_24c0 = vpblendvb_avx2(local_24c0,local_2400,auVar7);
          local_5a0 = local_24e0._0_8_;
          uStack_598 = local_24e0._8_8_;
          uStack_590 = local_24e0._16_8_;
          uStack_588 = local_24e0._24_8_;
          local_5c0 = local_2420._0_8_;
          uStack_5b8 = local_2420._8_8_;
          uStack_5b0 = local_2420._16_8_;
          uStack_5a8 = local_2420._24_8_;
          local_5e0 = local_26e0._0_8_;
          uStack_5d8 = local_26e0._8_8_;
          uStack_5d0 = uStack_26d0;
          uStack_5c8 = uStack_26c8;
          local_24e0 = vpblendvb_avx2(local_24e0,local_2420,auVar7);
          local_18a0 = local_2440._0_8_;
          uStack_1898 = local_2440._8_8_;
          uStack_1890 = local_2440._16_8_;
          uStack_1888 = local_2440._24_8_;
          local_620 = vpaddq_avx2(local_2440,(undefined1  [32])alVar26);
          local_600 = local_2500._0_8_;
          uStack_5f8 = local_2500._8_8_;
          uStack_5f0 = local_2500._16_8_;
          uStack_5e8 = local_2500._24_8_;
          local_640 = local_26e0._0_8_;
          uStack_638 = local_26e0._8_8_;
          uStack_630 = uStack_26d0;
          uStack_628 = uStack_26c8;
          local_2500 = vpblendvb_avx2(local_2500,local_620,auVar7);
          local_18c0 = lVar122;
          lStack_18b8 = lVar123;
          lStack_18b0 = lVar124;
          lStack_18a8 = lVar119;
          for (local_1f2c = 0; local_1f2c < local_1f4c + -2; local_1f2c = local_1f2c + 1) {
            auVar7 = vpermq_avx2(local_2460,0x90);
            auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x20,3);
            auVar8 = vpermq_avx2(local_24c0,0x90);
            auVar8 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
            auVar2 = vpermq_avx2(local_24e0,0x90);
            auVar2 = vpblendd_avx2(auVar2,ZEXT832(0) << 0x20,3);
            auVar3 = vpermq_avx2(local_2500,0x90);
            auVar3 = vpblendd_avx2(auVar3,ZEXT832(0) << 0x20,3);
            local_2760 = auVar7._0_8_;
            lStack_2758 = auVar7._8_8_;
            lStack_2750 = auVar7._16_8_;
            lStack_2748 = auVar7._24_8_;
            local_18e0 = local_2760;
            uStack_18d8 = lStack_2758;
            uStack_18d0 = lStack_2750;
            uStack_18c8 = lStack_2748;
            local_1900 = local_2220._0_8_;
            uStack_18f8 = local_2220._8_8_;
            uStack_18f0 = local_2220._16_8_;
            uStack_18e8 = local_2220._24_8_;
            auVar7 = vpaddq_avx2(auVar7,local_2220);
            local_2760 = auVar7._0_8_;
            lStack_2758 = auVar7._8_8_;
            lStack_2750 = auVar7._16_8_;
            lStack_2748 = auVar7._24_8_;
            local_e20 = local_2760;
            lStack_e18 = lStack_2758;
            lStack_e10 = lStack_2750;
            lStack_e08 = lStack_2748;
            local_e40 = local_2460._0_8_;
            lStack_e38 = local_2460._8_8_;
            lStack_e30 = local_2460._16_8_;
            lStack_e28 = local_2460._24_8_;
            local_160 = vpcmpgtq_avx2(auVar7,local_2460);
            local_1de0 = local_2760;
            lStack_1dd8 = lStack_2758;
            lStack_1dd0 = lStack_2750;
            lStack_1dc8 = lStack_2748;
            local_1e00 = local_2460._0_8_;
            lStack_1df8 = local_2460._8_8_;
            lStack_1df0 = local_2460._16_8_;
            lStack_1de8 = local_2460._24_8_;
            local_180 = -(ulong)(local_2760 == local_2460._0_8_);
            lStack_178 = -(ulong)(lStack_2758 == local_2460._8_8_);
            lStack_170 = -(ulong)(lStack_2750 == local_2460._16_8_);
            lStack_168 = -(ulong)(lStack_2748 == local_2460._24_8_);
            auVar58._8_8_ = lStack_178;
            auVar58._0_8_ = local_180;
            auVar58._16_8_ = lStack_170;
            auVar58._24_8_ = lStack_168;
            auVar7 = vpor_avx2(local_160,auVar58);
            a_03[1] = in_stack_ffffffffffffd7a0;
            a_03[0] = in_stack_ffffffffffffd798;
            a_03[2] = in_stack_ffffffffffffd7a8;
            a_03[3] = in_stack_ffffffffffffd7b0;
            b_03[1] = in_stack_ffffffffffffd780;
            b_03[0] = in_stack_ffffffffffffd778;
            b_03[2] = in_stack_ffffffffffffd788;
            b_03[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_03,b_03);
            local_660 = local_24c0._0_8_;
            uStack_658 = local_24c0._8_8_;
            uStack_650 = local_24c0._16_8_;
            uStack_648 = local_24c0._24_8_;
            local_2780 = auVar8._0_8_;
            local_680 = local_2780;
            uStack_2778 = auVar8._8_8_;
            uStack_678 = uStack_2778;
            uStack_2770 = auVar8._16_8_;
            uStack_670 = uStack_2770;
            uStack_2768 = auVar8._24_8_;
            uStack_668 = uStack_2768;
            local_26e0._0_8_ = auVar7._0_8_;
            local_6a0 = local_26e0._0_8_;
            local_26e0._8_8_ = auVar7._8_8_;
            uStack_698 = local_26e0._8_8_;
            uStack_26d0 = auVar7._16_8_;
            uStack_690 = uStack_26d0;
            uStack_26c8 = auVar7._24_8_;
            uStack_688 = uStack_26c8;
            local_24c0 = vpblendvb_avx2(local_24c0,auVar8,auVar7);
            local_6c0 = local_24e0._0_8_;
            uStack_6b8 = local_24e0._8_8_;
            uStack_6b0 = local_24e0._16_8_;
            uStack_6a8 = local_24e0._24_8_;
            local_27a0 = auVar2._0_8_;
            local_6e0 = local_27a0;
            uStack_2798 = auVar2._8_8_;
            uStack_6d8 = uStack_2798;
            uStack_2790 = auVar2._16_8_;
            uStack_6d0 = uStack_2790;
            uStack_2788 = auVar2._24_8_;
            uStack_6c8 = uStack_2788;
            local_700 = local_26e0._0_8_;
            uStack_6f8 = local_26e0._8_8_;
            uStack_6f0 = uStack_26d0;
            uStack_6e8 = uStack_26c8;
            local_24e0 = vpblendvb_avx2(local_24e0,auVar2,auVar7);
            local_720 = local_2500._0_8_;
            uStack_718 = local_2500._8_8_;
            uStack_710 = local_2500._16_8_;
            uStack_708 = local_2500._24_8_;
            local_27c0 = auVar3._0_8_;
            local_1920 = local_27c0;
            uStack_27b8 = auVar3._8_8_;
            uStack_1918 = uStack_27b8;
            uStack_27b0 = auVar3._16_8_;
            uStack_1910 = uStack_27b0;
            uStack_27a8 = auVar3._24_8_;
            uStack_1908 = uStack_27a8;
            local_1940 = local_2240._0_8_;
            uStack_1938 = local_2240._8_8_;
            uStack_1930 = local_2240._16_8_;
            uStack_1928 = local_2240._24_8_;
            local_740 = vpaddq_avx2(auVar3,local_2240);
            local_760 = local_26e0._0_8_;
            uStack_758 = local_26e0._8_8_;
            uStack_750 = uStack_26d0;
            uStack_748 = uStack_26c8;
            local_2500 = vpblendvb_avx2(local_2500,local_740,auVar7);
          }
          auVar7 = vpermq_avx2(local_2460,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_24c0,0x90);
          local_24c0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_24e0,0x90);
          local_24e0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_2500,0x90);
          local_2500 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          local_2460._0_8_ = auVar7._0_8_;
          local_2460._8_8_ = auVar7._8_8_;
          local_2460._16_8_ = auVar7._16_8_;
          local_2460._24_8_ = auVar7._24_8_;
          local_1960 = local_2460._0_8_;
          uStack_1958 = local_2460._8_8_;
          uStack_1950 = local_2460._16_8_;
          uStack_1948 = local_2460._24_8_;
          local_1980 = local_2200;
          uStack_1978 = uStack_21f8;
          uStack_1970 = uStack_21f0;
          uStack_1968 = uStack_21e8;
          auVar35._8_8_ = uStack_21f8;
          auVar35._0_8_ = local_2200;
          auVar35._16_8_ = uStack_21f0;
          auVar35._24_8_ = uStack_21e8;
          auVar7 = vpaddq_avx2(auVar7,auVar35);
          local_2460._0_8_ = auVar7._0_8_;
          local_2460._8_8_ = auVar7._8_8_;
          local_2460._16_8_ = auVar7._16_8_;
          local_2460._24_8_ = auVar7._24_8_;
          local_e60 = local_2460._0_8_;
          uStack_e58 = local_2460._8_8_;
          uStack_e50 = local_2460._16_8_;
          uStack_e48 = local_2460._24_8_;
          uStack_e78 = local_23e0._8_8_;
          uStack_e70 = local_23e0._16_8_;
          uStack_e68 = local_23e0._24_8_;
          auVar50._8_8_ = local_23e0._8_8_;
          auVar50._0_8_ = iVar1;
          auVar50._16_8_ = local_23e0._16_8_;
          auVar50._24_8_ = local_23e0._24_8_;
          auVar8 = vpcmpgtq_avx2(auVar7,auVar50);
          a_04[1] = in_stack_ffffffffffffd7a0;
          a_04[0] = in_stack_ffffffffffffd798;
          a_04[2] = in_stack_ffffffffffffd7a8;
          a_04[3] = in_stack_ffffffffffffd7b0;
          b_04[1] = in_stack_ffffffffffffd780;
          b_04[0] = in_stack_ffffffffffffd778;
          b_04[2] = in_stack_ffffffffffffd788;
          b_04[3] = in_stack_ffffffffffffd790;
          local_e80 = iVar1;
          _mm256_max_epi64_rpl(a_04,b_04);
          local_26e0._0_8_ = auVar8._0_8_;
          local_26e0._8_8_ = auVar8._8_8_;
          uStack_26d0 = auVar8._16_8_;
          uStack_26c8 = auVar8._24_8_;
          local_780 = local_2400._0_8_;
          uStack_778 = local_2400._8_8_;
          uStack_770 = local_2400._16_8_;
          uStack_768 = local_2400._24_8_;
          local_7a0 = local_24c0._0_8_;
          uStack_798 = local_24c0._8_8_;
          uStack_790 = local_24c0._16_8_;
          uStack_788 = local_24c0._24_8_;
          local_7c0 = local_26e0._0_8_;
          uStack_7b8 = local_26e0._8_8_;
          uStack_7b0 = uStack_26d0;
          uStack_7a8 = uStack_26c8;
          local_2540 = vpblendvb_avx2(local_2400,local_24c0,auVar8);
          local_7e0 = local_2420._0_8_;
          uStack_7d8 = local_2420._8_8_;
          uStack_7d0 = local_2420._16_8_;
          uStack_7c8 = local_2420._24_8_;
          local_800 = local_24e0._0_8_;
          uStack_7f8 = local_24e0._8_8_;
          uStack_7f0 = local_24e0._16_8_;
          uStack_7e8 = local_24e0._24_8_;
          local_820 = local_26e0._0_8_;
          uStack_818 = local_26e0._8_8_;
          uStack_810 = uStack_26d0;
          uStack_808 = uStack_26c8;
          local_2560 = vpblendvb_avx2(local_2420,local_24e0,auVar8);
          local_840 = local_2440._0_8_;
          uStack_838 = local_2440._8_8_;
          uStack_830 = local_2440._16_8_;
          uStack_828 = local_2440._24_8_;
          local_860 = local_2500._0_8_;
          uStack_858 = local_2500._8_8_;
          uStack_850 = local_2500._16_8_;
          uStack_848 = local_2500._24_8_;
          local_880 = local_26e0._0_8_;
          uStack_878 = local_26e0._8_8_;
          uStack_870 = uStack_26d0;
          uStack_868 = uStack_26c8;
          local_2580 = vpblendvb_avx2(local_2440,local_2500,auVar8);
          local_1f2c = 0;
          local_2520 = local_2460._0_8_;
          uStack_2518 = local_2460._8_8_;
          uStack_2510 = local_2460._16_8_;
          uStack_2508 = local_2460._24_8_;
          local_2460 = auVar7;
          while( true ) {
            if (local_1f50 <= local_1f2c) break;
            local_1020 = local_1f98 + (long)local_1f2c * 4;
            auVar62 = *(undefined1 (*) [24])local_1020;
            uVar70 = *(ulong *)*(undefined1 (*) [24])(local_1020 + 3);
            local_1028 = local_1fa0 + (long)local_1f2c * 4;
            auVar63 = *(undefined1 (*) [24])local_1028;
            uVar10 = *(undefined8 *)*(undefined1 (*) [24])(local_1028 + 3);
            auVar2 = *(undefined1 (*) [32])local_1028;
            local_1030 = local_1fa8 + (long)local_1f2c * 4;
            auVar64 = *(undefined1 (*) [24])local_1030;
            uVar11 = *(undefined8 *)*(undefined1 (*) [24])(local_1030 + 3);
            auVar3 = *(undefined1 (*) [32])local_1030;
            local_1038 = local_1fb0 + (long)local_1f2c * 4;
            auVar65 = *(undefined1 (*) [24])local_1038;
            uVar12 = *(undefined8 *)*(undefined1 (*) [24])(local_1038 + 3);
            auVar4 = *(undefined1 (*) [32])local_1038;
            local_1040 = local_1f78 + local_1f2c;
            local_1048 = local_1f80 + local_1f2c;
            auVar66 = *(undefined1 (*) [24])*local_1048;
            lVar122 = (*local_1048)[3];
            alVar26 = *local_1048;
            local_1050 = local_1f88 + local_1f2c;
            auVar67 = *(undefined1 (*) [24])*local_1050;
            lVar123 = (*local_1050)[3];
            alVar27 = *local_1050;
            local_1058 = local_1f90 + local_1f2c;
            auVar68 = *(undefined1 (*) [24])*local_1058;
            lVar124 = (*local_1058)[3];
            alVar28 = *local_1058;
            local_15a0 = local_2520;
            uStack_1598 = uStack_2518;
            uStack_1590 = uStack_2510;
            uStack_1588 = uStack_2508;
            local_15c0 = local_2020;
            uStack_15b8 = uStack_2018;
            uStack_15b0 = uStack_2010;
            uStack_15a8 = uStack_2008;
            auVar41._8_8_ = uStack_2518;
            auVar41._0_8_ = local_2520;
            auVar41._16_8_ = uStack_2510;
            auVar41._24_8_ = uStack_2508;
            auVar40._8_8_ = uStack_2018;
            auVar40._0_8_ = local_2020;
            auVar40._16_8_ = uStack_2010;
            auVar40._24_8_ = uStack_2008;
            auVar7 = vpsubq_avx2(auVar41,auVar40);
            local_15e0 = local_2460._0_8_;
            uStack_15d8 = local_2460._8_8_;
            uStack_15d0 = local_2460._16_8_;
            uStack_15c8 = local_2460._24_8_;
            auVar39._16_8_ = auStack_2030._0_8_;
            auVar39._0_16_ = local_2040;
            auVar39._24_8_ = auStack_2030._8_8_;
            auVar8 = vpsubq_avx2(local_2460,auVar39);
            local_24a0 = auVar7._0_8_;
            uStack_2498 = auVar7._8_8_;
            uStack_2490 = auVar7._16_8_;
            uStack_2488 = auVar7._24_8_;
            a_05[1] = in_stack_ffffffffffffd7a0;
            a_05[0] = in_stack_ffffffffffffd798;
            a_05[2] = in_stack_ffffffffffffd7a8;
            a_05[3] = in_stack_ffffffffffffd7b0;
            b_05[1] = in_stack_ffffffffffffd780;
            b_05[0] = in_stack_ffffffffffffd778;
            b_05[2] = in_stack_ffffffffffffd788;
            b_05[3] = in_stack_ffffffffffffd790;
            local_2460._0_8_ = local_24a0;
            local_2460._8_8_ = uStack_2498;
            local_2460._16_8_ = uStack_2490;
            local_2460._24_8_ = uStack_2488;
            local_1600 = local_2040;
            auStack_15f0 = auStack_2030;
            _mm256_max_epi64_rpl(a_05,b_05);
            local_2480 = auVar8._0_8_;
            uStack_2478 = auVar8._8_8_;
            uStack_2470 = auVar8._16_8_;
            uStack_2468 = auVar8._24_8_;
            local_ea0 = local_24a0;
            uStack_e98 = uStack_2498;
            uStack_e90 = uStack_2490;
            uStack_e88 = uStack_2488;
            local_ec0 = local_2480;
            uStack_eb8 = uStack_2478;
            uStack_eb0 = uStack_2470;
            uStack_ea8 = uStack_2468;
            auVar7 = vpcmpgtq_avx2(auVar7,auVar8);
            local_26e0._0_8_ = auVar7._0_8_;
            local_26e0._8_8_ = auVar7._8_8_;
            uStack_26d0 = auVar7._16_8_;
            uStack_26c8 = auVar7._24_8_;
            local_8a0 = local_24c0._0_8_;
            uStack_898 = local_24c0._8_8_;
            uStack_890 = local_24c0._16_8_;
            uStack_888 = local_24c0._24_8_;
            local_8c0 = local_2540._0_8_;
            uStack_8b8 = local_2540._8_8_;
            uStack_8b0 = local_2540._16_8_;
            uStack_8a8 = local_2540._24_8_;
            local_8e0 = local_26e0._0_8_;
            uStack_8d8 = local_26e0._8_8_;
            uStack_8d0 = uStack_26d0;
            uStack_8c8 = uStack_26c8;
            local_24c0 = vpblendvb_avx2(local_24c0,local_2540,auVar7);
            local_900 = local_24e0._0_8_;
            uStack_8f8 = local_24e0._8_8_;
            uStack_8f0 = local_24e0._16_8_;
            uStack_8e8 = local_24e0._24_8_;
            local_920 = local_2560._0_8_;
            uStack_918 = local_2560._8_8_;
            uStack_910 = local_2560._16_8_;
            uStack_908 = local_2560._24_8_;
            local_940 = local_26e0._0_8_;
            uStack_938 = local_26e0._8_8_;
            uStack_930 = uStack_26d0;
            uStack_928 = uStack_26c8;
            local_24e0 = vpblendvb_avx2(local_24e0,local_2560,auVar7);
            local_960 = local_2500._0_8_;
            uStack_958 = local_2500._8_8_;
            uStack_950 = local_2500._16_8_;
            uStack_948 = local_2500._24_8_;
            local_980 = local_2580._0_8_;
            uStack_978 = local_2580._8_8_;
            uStack_970 = local_2580._16_8_;
            uStack_968 = local_2580._24_8_;
            local_9a0 = local_26e0._0_8_;
            uStack_998 = local_26e0._8_8_;
            uStack_990 = uStack_26d0;
            uStack_988 = uStack_26c8;
            auVar7 = vpblendvb_avx2(local_2500,local_2580,auVar7);
            local_2500._0_8_ = auVar7._0_8_;
            local_2500._8_8_ = auVar7._8_8_;
            local_2500._16_8_ = auVar7._16_8_;
            local_2500._24_8_ = auVar7._24_8_;
            local_19a0 = local_2500._0_8_;
            uStack_1998 = local_2500._8_8_;
            uStack_1990 = local_2500._16_8_;
            uStack_1988 = local_2500._24_8_;
            local_19c0 = local_20a0;
            uStack_19b8 = uStack_2098;
            uStack_19b0 = uStack_2090;
            uStack_19a8 = uStack_2088;
            auVar34._8_8_ = uStack_2098;
            auVar34._0_8_ = local_20a0;
            auVar34._16_8_ = uStack_2090;
            auVar34._24_8_ = uStack_2088;
            local_2500 = vpaddq_avx2(auVar7,auVar34);
            local_25a0._0_8_ = auVar62._0_8_;
            local_25a0._8_8_ = auVar62._8_8_;
            local_25a0._16_8_ = auVar62._16_8_;
            a_06[1] = in_stack_ffffffffffffd7a0;
            a_06[0] = in_stack_ffffffffffffd798;
            a_06[2] = in_stack_ffffffffffffd7a8;
            a_06[3] = in_stack_ffffffffffffd7b0;
            b_06[1] = in_stack_ffffffffffffd780;
            b_06[0] = in_stack_ffffffffffffd778;
            b_06[2] = in_stack_ffffffffffffd788;
            b_06[3] = in_stack_ffffffffffffd790;
            local_2520 = local_25a0._0_8_;
            uStack_2518 = local_25a0._8_8_;
            uStack_2510 = local_25a0._16_8_;
            uStack_2508 = uVar70;
            _mm256_max_epi64_rpl(a_06,b_06);
            a_07[1] = in_stack_ffffffffffffd7a0;
            a_07[0] = in_stack_ffffffffffffd798;
            a_07[2] = in_stack_ffffffffffffd7a8;
            a_07[3] = in_stack_ffffffffffffd7b0;
            b_07[1] = in_stack_ffffffffffffd780;
            b_07[0] = in_stack_ffffffffffffd778;
            b_07[2] = in_stack_ffffffffffffd788;
            b_07[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_07,b_07);
            local_1e40 = local_25a0._0_8_;
            uStack_1e38 = local_25a0._8_8_;
            uStack_1e30 = local_25a0._16_8_;
            local_be0 = -(ulong)(local_2520 == local_25a0._0_8_);
            lStack_bd8 = -(ulong)(uStack_2518 == local_25a0._8_8_);
            lStack_bd0 = -(ulong)(uStack_2510 == local_25a0._16_8_);
            lStack_bc8 = -(ulong)(uStack_2508 == uVar70);
            local_26e0._8_8_ = lStack_bd8;
            local_26e0._0_8_ = local_be0;
            local_b80 = -(ulong)(local_2520 == local_2460._0_8_);
            lStack_b78 = -(ulong)(uStack_2518 == local_2460._8_8_);
            lStack_b70 = -(ulong)(uStack_2510 == local_2460._16_8_);
            lStack_b68 = -(ulong)(uStack_2508 == local_2460._24_8_);
            local_2380 = auVar66._0_8_;
            lStack_2378 = auVar66._8_8_;
            lStack_2370 = auVar66._16_8_;
            local_9c0 = local_2380;
            uStack_9b8 = lStack_2378;
            uStack_9b0 = lStack_2370;
            local_9e0 = local_24c0._0_8_;
            uStack_9d8 = local_24c0._8_8_;
            uStack_9d0 = local_24c0._16_8_;
            uStack_9c8 = local_24c0._24_8_;
            auVar57._8_8_ = lStack_b78;
            auVar57._0_8_ = local_b80;
            auVar57._16_8_ = lStack_b70;
            auVar57._24_8_ = lStack_b68;
            local_a20 = vpblendvb_avx2((undefined1  [32])alVar26,local_24c0,auVar57);
            local_25c0._0_8_ = auVar63._0_8_;
            local_25c0._8_8_ = auVar63._8_8_;
            local_25c0._16_8_ = auVar63._16_8_;
            local_a40 = local_25c0._0_8_;
            uStack_a38 = local_25c0._8_8_;
            uStack_a30 = local_25c0._16_8_;
            auVar56._16_8_ = lStack_bd0;
            auVar56._0_16_ = local_26e0;
            auVar56._24_8_ = lStack_bc8;
            local_2540 = vpblendvb_avx2(local_a20,auVar2,auVar56);
            local_23a0 = auVar67._0_8_;
            lStack_2398 = auVar67._8_8_;
            lStack_2390 = auVar67._16_8_;
            local_a80 = local_23a0;
            uStack_a78 = lStack_2398;
            uStack_a70 = lStack_2390;
            local_aa0 = local_24e0._0_8_;
            uStack_a98 = local_24e0._8_8_;
            uStack_a90 = local_24e0._16_8_;
            uStack_a88 = local_24e0._24_8_;
            auVar55._8_8_ = lStack_b78;
            auVar55._0_8_ = local_b80;
            auVar55._16_8_ = lStack_b70;
            auVar55._24_8_ = lStack_b68;
            local_ae0 = vpblendvb_avx2((undefined1  [32])alVar27,local_24e0,auVar55);
            local_25e0._0_8_ = auVar64._0_8_;
            local_25e0._8_8_ = auVar64._8_8_;
            local_25e0._16_8_ = auVar64._16_8_;
            local_b00 = local_25e0._0_8_;
            uStack_af8 = local_25e0._8_8_;
            uStack_af0 = local_25e0._16_8_;
            auVar54._16_8_ = lStack_bd0;
            auVar54._0_16_ = local_26e0;
            auVar54._24_8_ = lStack_bc8;
            local_2560 = vpblendvb_avx2(local_ae0,auVar3,auVar54);
            local_23c0 = auVar68._0_8_;
            lStack_23b8 = auVar68._8_8_;
            lStack_23b0 = auVar68._16_8_;
            local_b40 = local_23c0;
            uStack_b38 = lStack_23b8;
            uStack_b30 = lStack_23b0;
            local_b60 = local_2500._0_8_;
            uStack_b58 = local_2500._8_8_;
            uStack_b50 = local_2500._16_8_;
            uStack_b48 = local_2500._24_8_;
            auVar53._8_8_ = lStack_b78;
            auVar53._0_8_ = local_b80;
            auVar53._16_8_ = lStack_b70;
            auVar53._24_8_ = lStack_b68;
            local_ba0 = vpblendvb_avx2((undefined1  [32])alVar28,local_2500,auVar53);
            local_2600._0_8_ = auVar65._0_8_;
            local_2600._8_8_ = auVar65._8_8_;
            local_2600._16_8_ = auVar65._16_8_;
            local_bc0 = local_2600._0_8_;
            uStack_bb8 = local_2600._8_8_;
            uStack_bb0 = local_2600._16_8_;
            auVar52._16_8_ = lStack_bd0;
            auVar52._0_16_ = local_26e0;
            auVar52._24_8_ = lStack_bc8;
            local_2580 = vpblendvb_avx2(local_ba0,auVar4,auVar52);
            local_1348 = local_1f98 + (long)local_1f2c * 4;
            *local_1348 = local_2520;
            local_1348[1] = uStack_2518;
            local_1348[2] = uStack_2510;
            local_1348[3] = uStack_2508;
            local_1388 = local_1fa0 + (long)local_1f2c * 4;
            local_13c0 = local_2540._0_8_;
            lStack_13b8 = local_2540._8_8_;
            lStack_13b0 = local_2540._16_8_;
            uStack_13a8 = local_2540._24_8_;
            *local_1388 = local_2540._0_8_;
            local_1388[1] = local_2540._8_8_;
            local_1388[2] = local_2540._16_8_;
            local_1388[3] = local_2540._24_8_;
            local_13c8 = local_1fa8 + (long)local_1f2c * 4;
            local_1400 = local_2560._0_8_;
            lStack_13f8 = local_2560._8_8_;
            lStack_13f0 = local_2560._16_8_;
            uStack_13e8 = local_2560._24_8_;
            *local_13c8 = local_2560._0_8_;
            local_13c8[1] = local_2560._8_8_;
            local_13c8[2] = local_2560._16_8_;
            local_13c8[3] = local_2560._24_8_;
            local_1408 = local_1fb0 + (long)local_1f2c * 4;
            local_1440 = local_2580._0_8_;
            lStack_1438 = local_2580._8_8_;
            lStack_1430 = local_2580._16_8_;
            uStack_1428 = local_2580._24_8_;
            *local_1408 = local_2580._0_8_;
            local_1408[1] = local_2580._8_8_;
            local_1408[2] = local_2580._16_8_;
            local_1408[3] = local_2580._24_8_;
            a_08[1] = in_stack_ffffffffffffd7a0;
            a_08[0] = in_stack_ffffffffffffd798;
            a_08[2] = in_stack_ffffffffffffd7a8;
            a_08[3] = in_stack_ffffffffffffd7b0;
            b_08[1] = in_stack_ffffffffffffd780;
            b_08[0] = in_stack_ffffffffffffd778;
            b_08[2] = in_stack_ffffffffffffd788;
            b_08[3] = in_stack_ffffffffffffd790;
            local_1e80 = local_2460._0_8_;
            uStack_1e78 = local_2460._8_8_;
            uStack_1e70 = local_2460._16_8_;
            uStack_1e68 = local_2460._24_8_;
            local_1e60 = local_2520;
            uStack_1e58 = uStack_2518;
            uStack_1e50 = uStack_2510;
            uStack_1e48 = uStack_2508;
            uStack_1e28 = uVar70;
            local_1e20 = local_2520;
            uStack_1e18 = uStack_2518;
            uStack_1e10 = uStack_2510;
            uStack_1e08 = uStack_2508;
            local_1380 = local_2520;
            uStack_1378 = uStack_2518;
            uStack_1370 = uStack_2510;
            uStack_1368 = uStack_2508;
            uStack_ba8 = uVar12;
            lStack_b28 = lVar124;
            local_b20 = local_be0;
            lStack_b18 = lStack_bd8;
            lStack_b10 = lStack_bd0;
            lStack_b08 = lStack_bc8;
            uStack_ae8 = uVar11;
            local_ac0 = local_b80;
            lStack_ab8 = lStack_b78;
            lStack_ab0 = lStack_b70;
            lStack_aa8 = lStack_b68;
            lStack_a68 = lVar123;
            local_a60 = local_be0;
            lStack_a58 = lStack_bd8;
            lStack_a50 = lStack_bd0;
            lStack_a48 = lStack_bc8;
            uStack_a28 = uVar10;
            local_a00 = local_b80;
            lStack_9f8 = lStack_b78;
            lStack_9f0 = lStack_b70;
            lStack_9e8 = lStack_b68;
            lStack_9a8 = lVar122;
            _mm256_min_epi64_rpl(a_08,b_08);
            a_09[1] = in_stack_ffffffffffffd7a0;
            a_09[0] = in_stack_ffffffffffffd798;
            a_09[2] = in_stack_ffffffffffffd7a8;
            a_09[3] = in_stack_ffffffffffffd7b0;
            b_09[1] = in_stack_ffffffffffffd780;
            b_09[0] = in_stack_ffffffffffffd778;
            b_09[2] = in_stack_ffffffffffffd788;
            b_09[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_09,b_09);
            a_10[1] = in_stack_ffffffffffffd7a0;
            a_10[0] = in_stack_ffffffffffffd798;
            a_10[2] = in_stack_ffffffffffffd7a8;
            a_10[3] = in_stack_ffffffffffffd7b0;
            b_10[1] = in_stack_ffffffffffffd780;
            b_10[0] = in_stack_ffffffffffffd778;
            b_10[2] = in_stack_ffffffffffffd788;
            b_10[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_10,b_10);
            a_11[1] = in_stack_ffffffffffffd7a0;
            a_11[0] = in_stack_ffffffffffffd798;
            a_11[2] = in_stack_ffffffffffffd7a8;
            a_11[3] = in_stack_ffffffffffffd7b0;
            b_11[1] = in_stack_ffffffffffffd780;
            b_11[0] = in_stack_ffffffffffffd778;
            b_11[2] = in_stack_ffffffffffffd788;
            b_11[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_11,b_11);
            a_12[1] = in_stack_ffffffffffffd7a0;
            a_12[0] = in_stack_ffffffffffffd798;
            a_12[2] = in_stack_ffffffffffffd7a8;
            a_12[3] = in_stack_ffffffffffffd7b0;
            b_12[1] = in_stack_ffffffffffffd780;
            b_12[0] = in_stack_ffffffffffffd778;
            b_12[2] = in_stack_ffffffffffffd788;
            b_12[3] = in_stack_ffffffffffffd790;
            _mm256_max_epi64_rpl(a_12,b_12);
            local_1f2c = local_1f2c + 1;
          }
          local_1060 = local_1f98 + (long)local_1f54 * 4;
          local_ee0 = *local_1060;
          lStack_ed8 = local_1060[1];
          lStack_ed0 = local_1060[2];
          lStack_ec8 = local_1060[3];
          local_1068 = local_1fa0 + (long)local_1f54 * 4;
          auVar62 = *(undefined1 (*) [24])local_1068;
          uVar10 = *(undefined8 *)*(undefined1 (*) [24])(local_1068 + 3);
          auVar8 = *(undefined1 (*) [32])local_1068;
          local_1070 = local_1fa8 + (long)local_1f54 * 4;
          auVar63 = *(undefined1 (*) [24])local_1070;
          uVar11 = *(undefined8 *)*(undefined1 (*) [24])(local_1070 + 3);
          auVar2 = *(undefined1 (*) [32])local_1070;
          local_1078 = local_1fb0 + (long)local_1f54 * 4;
          auVar64 = *(undefined1 (*) [24])local_1078;
          uVar12 = *(undefined8 *)*(undefined1 (*) [24])(local_1078 + 3);
          auVar3 = *(undefined1 (*) [32])local_1078;
          local_f00 = local_2160._0_8_;
          uStack_ef8 = local_2160._8_8_;
          uStack_ef0 = local_2160._16_8_;
          uStack_ee8 = local_2160._24_8_;
          auVar7 = vpcmpgtq_avx2(*(undefined1 (*) [32])local_1060,local_2160);
          a_13[1] = in_stack_ffffffffffffd7a0;
          a_13[0] = in_stack_ffffffffffffd798;
          a_13[2] = in_stack_ffffffffffffd7a8;
          a_13[3] = in_stack_ffffffffffffd7b0;
          b_13[1] = in_stack_ffffffffffffd780;
          b_13[0] = in_stack_ffffffffffffd778;
          b_13[2] = in_stack_ffffffffffffd788;
          b_13[3] = in_stack_ffffffffffffd790;
          _mm256_max_epi64_rpl(a_13,b_13);
          local_c00 = local_2180._0_8_;
          uStack_bf8 = local_2180._8_8_;
          uStack_bf0 = local_2180._16_8_;
          uStack_be8 = local_2180._24_8_;
          local_2540._0_8_ = auVar62._0_8_;
          local_c20 = local_2540._0_8_;
          local_2540._8_8_ = auVar62._8_8_;
          uStack_c18 = local_2540._8_8_;
          local_2540._16_8_ = auVar62._16_8_;
          uStack_c10 = local_2540._16_8_;
          local_27e0 = auVar7._0_8_;
          local_c40 = local_27e0;
          uStack_27d8 = auVar7._8_8_;
          uStack_c38 = uStack_27d8;
          uStack_27d0 = auVar7._16_8_;
          uStack_c30 = uStack_27d0;
          uStack_27c8 = auVar7._24_8_;
          uStack_c28 = uStack_27c8;
          local_2180 = vpblendvb_avx2(local_2180,auVar8,auVar7);
          local_c60 = local_21a0._0_8_;
          uStack_c58 = local_21a0._8_8_;
          uStack_c50 = local_21a0._16_8_;
          uStack_c48 = local_21a0._24_8_;
          local_2560._0_8_ = auVar63._0_8_;
          local_c80 = local_2560._0_8_;
          local_2560._8_8_ = auVar63._8_8_;
          uStack_c78 = local_2560._8_8_;
          local_2560._16_8_ = auVar63._16_8_;
          uStack_c70 = local_2560._16_8_;
          local_ca0 = local_27e0;
          uStack_c98 = uStack_27d8;
          uStack_c90 = uStack_27d0;
          uStack_c88 = uStack_27c8;
          local_21a0 = vpblendvb_avx2(local_21a0,auVar2,auVar7);
          local_cc0 = local_21c0._0_8_;
          uStack_cb8 = local_21c0._8_8_;
          uStack_cb0 = local_21c0._16_8_;
          uStack_ca8 = local_21c0._24_8_;
          local_2580._0_8_ = auVar64._0_8_;
          local_ce0 = local_2580._0_8_;
          local_2580._8_8_ = auVar64._8_8_;
          uStack_cd8 = local_2580._8_8_;
          local_2580._16_8_ = auVar64._16_8_;
          uStack_cd0 = local_2580._16_8_;
          local_d00 = local_27e0;
          uStack_cf8 = uStack_27d8;
          uStack_cf0 = uStack_27d0;
          uStack_ce8 = uStack_27c8;
          local_21c0 = vpblendvb_avx2(local_21c0,auVar3,auVar7);
          local_60 = local_21e0;
          lStack_58 = lStack_21d8;
          lStack_50 = lStack_21d0;
          lStack_48 = lStack_21c8;
          local_80 = local_27e0;
          uStack_78 = uStack_27d8;
          uStack_70 = uStack_27d0;
          uStack_68 = uStack_27c8;
          auVar61._8_8_ = lStack_21d8;
          auVar61._0_8_ = local_21e0;
          auVar61._16_8_ = lStack_21d0;
          auVar61._24_8_ = lStack_21c8;
          local_a0 = vpand_avx2(auVar61,auVar7);
          if ((((((((((((((((((((((((((((((((local_a0 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (local_a0 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (local_a0 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (local_a0 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_a0 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_a0 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_a0 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_a0 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_a0 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_a0 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_a0 >> 0x57 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_a0 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_a0 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_a0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || SUB321(local_a0 >> 0x7f,0) != '\0') ||
                            (local_a0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (local_a0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_a0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_a0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_a0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_a0 >> 0xbf,0) != '\0') ||
                    (local_a0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_a0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_a0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_a0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_a0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_a0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              local_a0[0x1f] < '\0') {
            local_1f40 = local_1f30;
          }
          uStack_cc8 = uVar12;
          uStack_c68 = uVar11;
          uStack_c08 = uVar10;
        }
        if (s2_beg != 0) {
          for (local_1f34 = 0; local_1f34 < local_1f58; local_1f34 = local_1f34 + 1) {
            auVar73 = ZEXT816(0) << 0x40;
            auVar7 = vpermq_avx2(local_2160,0x90);
            local_2160 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            auVar7 = vpermq_avx2(local_2180,0x90);
            local_2180 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            auVar7 = vpermq_avx2(local_21a0,0x90);
            local_21a0 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            auVar7 = vpermq_avx2(local_21c0,0x90);
            local_21c0 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
          }
          local_1f3c = local_1f38 + -1;
          local_20a8 = local_2160._24_8_;
          local_20b0 = local_2180._24_8_;
          local_20b8 = local_21a0._24_8_;
          local_20c0 = local_21c0._24_8_;
        }
        if (in_stack_00000008 != 0) {
          local_27e8 = local_1f98;
          local_27f0 = local_1fa0;
          local_27f8 = local_1fa8;
          local_2800 = local_1fb0;
          for (local_1f2c = 0; local_1f2c < local_1f50 * local_1f4c; local_1f2c = local_1f2c + 1) {
            iVar117 = local_1f2c / local_1f4c + (local_1f2c % local_1f4c) * local_1f50;
            if (iVar117 < local_1f38) {
              if ((long)local_20a8 < *local_27e8) {
                local_20a8 = *local_27e8;
                local_1f40 = local_1f1c + -1;
                local_20b0 = *local_27f0;
                local_20b8 = *local_27f8;
                local_20c0 = *local_2800;
                local_1f3c = iVar117;
              }
              else if (((*local_27e8 == local_20a8) && (local_1f40 == local_1f1c + -1)) &&
                      (iVar117 < local_1f3c)) {
                local_20b0 = *local_27f0;
                local_20b8 = *local_27f8;
                local_20c0 = *local_2800;
                local_1f3c = iVar117;
              }
            }
            local_27e8 = local_27e8 + 1;
            local_27f0 = local_27f0 + 1;
            local_27f8 = local_27f8 + 1;
            local_2800 = local_2800 + 1;
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_1080 = local_1f98 + (long)local_1f54 * 4;
          local_2840 = *(undefined1 (*) [32])local_1080;
          local_1088 = local_1fa0 + (long)local_1f54 * 4;
          lVar122 = *local_1088;
          lVar123 = local_1088[1];
          lVar124 = local_1088[2];
          lStack_2848 = local_1088[3];
          local_1090 = local_1fa8 + (long)local_1f54 * 4;
          lVar119 = *local_1090;
          lVar120 = local_1090[1];
          lVar121 = local_1090[2];
          local_20b8 = local_1090[3];
          local_1098 = local_1fb0 + (long)local_1f54 * 4;
          local_28a0 = *local_1098;
          lStack_2898 = local_1098[1];
          lVar118 = local_1098[2];
          local_20c0 = local_1098[3];
          for (local_1f34 = 0; local_1f34 < local_1f58; local_1f34 = local_1f34 + 1) {
            auVar73 = ZEXT816(0) << 0x40;
            auVar7 = vpermq_avx2(local_2840,0x90);
            local_2840 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            auVar33._8_8_ = lVar123;
            auVar33._0_8_ = lVar122;
            auVar33._16_8_ = lVar124;
            auVar33._24_8_ = lStack_2848;
            auVar7 = vpermq_avx2(auVar33,0x90);
            auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            lVar122 = auVar7._0_8_;
            lVar123 = auVar7._8_8_;
            lVar124 = auVar7._16_8_;
            lStack_2848 = auVar7._24_8_;
            auVar32._8_8_ = lVar120;
            auVar32._0_8_ = lVar119;
            auVar32._16_8_ = lVar121;
            auVar32._24_8_ = local_20b8;
            auVar7 = vpermq_avx2(auVar32,0x90);
            auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            lVar119 = auVar7._0_8_;
            lVar120 = auVar7._8_8_;
            lVar121 = auVar7._16_8_;
            local_20b8 = auVar7._24_8_;
            auVar31._8_8_ = lStack_2898;
            auVar31._0_8_ = local_28a0;
            auVar31._16_8_ = lVar118;
            auVar31._24_8_ = local_20c0;
            auVar7 = vpermq_avx2(auVar31,0x90);
            auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar73),3);
            local_28a0 = auVar7._0_8_;
            lStack_2898 = auVar7._8_8_;
            lVar118 = auVar7._16_8_;
            local_20c0 = auVar7._24_8_;
          }
          local_1f40 = local_1f1c + -1;
          local_1f3c = local_1f38 + -1;
          local_20a8 = local_2840._24_8_;
          local_20b0 = lStack_2848;
        }
        local_f20 = local_20e0;
        uStack_f18 = uStack_20d8;
        uStack_f10 = uStack_20d0;
        uStack_f08 = uStack_20c8;
        local_f40 = local_2120;
        uStack_f38 = uStack_2118;
        uStack_f30 = uStack_2110;
        uStack_f28 = uStack_2108;
        auVar49._8_8_ = uStack_20d8;
        auVar49._0_8_ = local_20e0;
        auVar49._16_8_ = uStack_20d0;
        auVar49._24_8_ = uStack_20c8;
        auVar48._8_8_ = uStack_2118;
        auVar48._0_8_ = local_2120;
        auVar48._16_8_ = uStack_2110;
        auVar48._24_8_ = uStack_2108;
        local_1a0 = vpcmpgtq_avx2(auVar49,auVar48);
        local_f60 = local_2140;
        uStack_f58 = uStack_2138;
        uStack_f50 = uStack_2130;
        uStack_f48 = uStack_2128;
        local_f80 = local_2100;
        uStack_f78 = uStack_20f8;
        uStack_f70 = uStack_20f0;
        uStack_f68 = uStack_20e8;
        auVar47._8_8_ = uStack_2138;
        auVar47._0_8_ = local_2140;
        auVar47._16_8_ = uStack_2130;
        auVar47._24_8_ = uStack_2128;
        auVar46._8_8_ = uStack_20f8;
        auVar46._0_8_ = local_2100;
        auVar46._16_8_ = uStack_20f0;
        auVar46._24_8_ = uStack_20e8;
        local_1c0 = vpcmpgtq_avx2(auVar47,auVar46);
        local_c0 = vpor_avx2(local_1a0,local_1c0);
        if ((((((((((((((((((((((((((((((((local_c0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_c0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_c0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_c0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_c0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_c0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_c0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_c0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_c0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_c0 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_c0 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_c0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_c0 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_c0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_c0 >> 0x7f,0) != '\0') ||
                          (local_c0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_c0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_c0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_c0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_c0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_c0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_c0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_c0 >> 0xbf,0) != '\0') ||
                  (local_c0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_c0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_c0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_c0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_c0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_c0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_c0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_c0[0x1f] < '\0') {
          local_2248->flag = local_2248->flag | 0x40;
          local_20a8 = 0;
          local_20b0 = 0;
          local_20b8 = 0;
          local_20c0 = 0;
          local_1f3c = 0;
          local_1f40 = 0;
        }
        local_2248->score = (int)local_20a8;
        local_2248->end_query = local_1f3c;
        local_2248->end_ref = local_1f40;
        ((local_2248->field_4).stats)->matches = (int)local_20b0;
        ((local_2248->field_4).stats)->similar = (int)local_20b8;
        ((local_2248->field_4).stats)->length = (int)local_20c0;
        parasail_free(local_1fe8);
        parasail_free(local_1fe0);
        parasail_free(local_1fd8);
        parasail_free(local_1fd0);
        parasail_free(local_1fc8);
        parasail_free(local_1fc0);
        parasail_free(local_1fb8);
        parasail_free(local_1fb0);
        parasail_free(local_1fa8);
        parasail_free(local_1fa0);
        parasail_free(local_1f98);
        parasail_free(local_1f90);
        parasail_free(local_1f88);
        parasail_free(local_1f80);
        parasail_free(local_1f78);
        local_1f08 = local_2248;
      }
    }
  }
  return local_1f08;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}